

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,16>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
               (Precalculations *pre,RayK<16> *ray,size_t k,RayQueryContext *context,Primitive *prim
               )

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  RTCFilterFunctionN p_Var9;
  void *pvVar10;
  __int_type_conflict _Var11;
  undefined8 uVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar30;
  uint uVar31;
  long lVar32;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar51 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar85 [64];
  undefined1 auVar87 [64];
  undefined1 auVar89 [64];
  undefined1 auVar91 [64];
  undefined1 auVar93 [64];
  undefined1 auVar95 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  int iVar101;
  float t1;
  float fVar102;
  undefined1 auVar103 [16];
  float fVar105;
  float fVar106;
  undefined1 auVar104 [64];
  undefined4 uVar107;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  float fVar126;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  float fVar142;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vfloat4 b0;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  vfloat4 b0_1;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  float fVar176;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar163 [16];
  undefined1 auVar175 [32];
  vfloat4 a0_3;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [32];
  vfloat4 a0_2;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  float fVar197;
  float fVar208;
  float fVar209;
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  float fVar210;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar222;
  float fVar223;
  float fVar224;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar225;
  float fVar232;
  float fVar233;
  float fVar234;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  vfloat4 a0;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  vfloat4 a0_1;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  int iVar253;
  undefined1 in_ZMM30 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  vint<16> mask;
  BBox1f cv_stack [4];
  bool local_771;
  float local_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  uint auStack_5f0 [4];
  RTCFilterFunctionNArguments local_5e0;
  undefined1 local_5b0 [8];
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [16];
  undefined1 local_590 [16];
  undefined1 local_580 [16];
  undefined1 local_570 [8];
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [8];
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [16];
  undefined1 local_490 [16];
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  uint uStack_460;
  float afStack_45c [7];
  undefined1 local_440 [64];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  ulong auStack_3a0 [4];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  ulong uVar29;
  undefined1 auVar86 [64];
  undefined1 auVar54 [16];
  undefined1 auVar88 [64];
  undefined1 auVar90 [64];
  undefined1 auVar92 [64];
  undefined1 auVar94 [64];
  undefined1 auVar96 [64];
  undefined1 auVar239 [32];
  
  PVar6 = prim[1];
  uVar28 = (ulong)(byte)PVar6;
  fVar213 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar50 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar41 = vinsertps_avx(auVar50,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar39 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  fVar126 = fVar213 * auVar39._0_4_;
  fVar102 = fVar213 * auVar41._0_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar69 = vpmovsxbd_avx2(auVar38);
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar67 = vpmovsxbd_avx2(auVar50);
  auVar67 = vcvtdq2ps_avx(auVar67);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar68 = vpmovsxbd_avx2(auVar3);
  auVar68 = vcvtdq2ps_avx(auVar68);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar79 = vpmovsxbd_avx2(auVar49);
  auVar79 = vcvtdq2ps_avx(auVar79);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar6 * 0xc) + 6);
  auVar80 = vpmovsxbd_avx2(auVar48);
  auVar80 = vcvtdq2ps_avx(auVar80);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + (uint)(byte)PVar6 * 0xc + uVar28 + 6);
  auVar70 = vpmovsxbd_avx2(auVar47);
  auVar70 = vcvtdq2ps_avx(auVar70);
  uVar35 = (ulong)(uint)((int)(uVar28 * 9) * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar71 = vpmovsxbd_avx2(auVar4);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar35 + uVar28 + 6);
  auVar74 = vpmovsxbd_avx2(auVar46);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar72 = vcvtdq2ps_avx(auVar74);
  uVar33 = (ulong)(uint)((int)(uVar28 * 5) << 2);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar65 = vpmovsxbd_avx2(auVar5);
  auVar73 = vcvtdq2ps_avx(auVar65);
  auVar133._4_4_ = fVar102;
  auVar133._0_4_ = fVar102;
  auVar133._8_4_ = fVar102;
  auVar133._12_4_ = fVar102;
  auVar133._16_4_ = fVar102;
  auVar133._20_4_ = fVar102;
  auVar133._24_4_ = fVar102;
  auVar133._28_4_ = fVar102;
  auVar246._8_4_ = 1;
  auVar246._0_8_ = 0x100000001;
  auVar246._12_4_ = 1;
  auVar246._16_4_ = 1;
  auVar246._20_4_ = 1;
  auVar246._24_4_ = 1;
  auVar246._28_4_ = 1;
  auVar75 = ZEXT1632(CONCAT412(fVar213 * auVar41._12_4_,
                               CONCAT48(fVar213 * auVar41._8_4_,
                                        CONCAT44(fVar213 * auVar41._4_4_,fVar102))));
  auVar66 = vpermps_avx2(auVar246,auVar75);
  auVar63 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar252 = ZEXT3264(auVar63);
  auVar64 = vpermps_avx512vl(auVar63,auVar75);
  fVar102 = auVar64._0_4_;
  fVar212 = auVar64._4_4_;
  auVar75._4_4_ = fVar212 * auVar68._4_4_;
  auVar75._0_4_ = fVar102 * auVar68._0_4_;
  fVar197 = auVar64._8_4_;
  auVar75._8_4_ = fVar197 * auVar68._8_4_;
  fVar208 = auVar64._12_4_;
  auVar75._12_4_ = fVar208 * auVar68._12_4_;
  fVar209 = auVar64._16_4_;
  auVar75._16_4_ = fVar209 * auVar68._16_4_;
  fVar105 = auVar64._20_4_;
  auVar75._20_4_ = fVar105 * auVar68._20_4_;
  fVar106 = auVar64._24_4_;
  auVar75._24_4_ = fVar106 * auVar68._24_4_;
  auVar75._28_4_ = auVar74._28_4_;
  auVar74._4_4_ = auVar70._4_4_ * fVar212;
  auVar74._0_4_ = auVar70._0_4_ * fVar102;
  auVar74._8_4_ = auVar70._8_4_ * fVar197;
  auVar74._12_4_ = auVar70._12_4_ * fVar208;
  auVar74._16_4_ = auVar70._16_4_ * fVar209;
  auVar74._20_4_ = auVar70._20_4_ * fVar105;
  auVar74._24_4_ = auVar70._24_4_ * fVar106;
  auVar74._28_4_ = auVar65._28_4_;
  auVar65._4_4_ = auVar73._4_4_ * fVar212;
  auVar65._0_4_ = auVar73._0_4_ * fVar102;
  auVar65._8_4_ = auVar73._8_4_ * fVar197;
  auVar65._12_4_ = auVar73._12_4_ * fVar208;
  auVar65._16_4_ = auVar73._16_4_ * fVar209;
  auVar65._20_4_ = auVar73._20_4_ * fVar105;
  auVar65._24_4_ = auVar73._24_4_ * fVar106;
  auVar65._28_4_ = auVar64._28_4_;
  auVar38 = vfmadd231ps_fma(auVar75,auVar66,auVar67);
  auVar50 = vfmadd231ps_fma(auVar74,auVar66,auVar80);
  auVar3 = vfmadd231ps_fma(auVar65,auVar72,auVar66);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar133,auVar69);
  auVar50 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar133,auVar79);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar71,auVar133);
  auVar140._4_4_ = fVar126;
  auVar140._0_4_ = fVar126;
  auVar140._8_4_ = fVar126;
  auVar140._12_4_ = fVar126;
  auVar140._16_4_ = fVar126;
  auVar140._20_4_ = fVar126;
  auVar140._24_4_ = fVar126;
  auVar140._28_4_ = fVar126;
  auVar65 = ZEXT1632(CONCAT412(fVar213 * auVar39._12_4_,
                               CONCAT48(fVar213 * auVar39._8_4_,
                                        CONCAT44(fVar213 * auVar39._4_4_,fVar126))));
  auVar74 = vpermps_avx2(auVar246,auVar65);
  auVar65 = vpermps_avx512vl(auVar63,auVar65);
  auVar66 = vmulps_avx512vl(auVar65,auVar68);
  auVar77._0_4_ = auVar65._0_4_ * auVar70._0_4_;
  auVar77._4_4_ = auVar65._4_4_ * auVar70._4_4_;
  auVar77._8_4_ = auVar65._8_4_ * auVar70._8_4_;
  auVar77._12_4_ = auVar65._12_4_ * auVar70._12_4_;
  auVar77._16_4_ = auVar65._16_4_ * auVar70._16_4_;
  auVar77._20_4_ = auVar65._20_4_ * auVar70._20_4_;
  auVar77._24_4_ = auVar65._24_4_ * auVar70._24_4_;
  auVar77._28_4_ = 0;
  auVar70._4_4_ = auVar65._4_4_ * auVar73._4_4_;
  auVar70._0_4_ = auVar65._0_4_ * auVar73._0_4_;
  auVar70._8_4_ = auVar65._8_4_ * auVar73._8_4_;
  auVar70._12_4_ = auVar65._12_4_ * auVar73._12_4_;
  auVar70._16_4_ = auVar65._16_4_ * auVar73._16_4_;
  auVar70._20_4_ = auVar65._20_4_ * auVar73._20_4_;
  auVar70._24_4_ = auVar65._24_4_ * auVar73._24_4_;
  auVar70._28_4_ = auVar68._28_4_;
  auVar67 = vfmadd231ps_avx512vl(auVar66,auVar74,auVar67);
  auVar49 = vfmadd231ps_fma(auVar77,auVar74,auVar80);
  auVar48 = vfmadd231ps_fma(auVar70,auVar74,auVar72);
  auVar67 = vfmadd231ps_avx512vl(auVar67,auVar140,auVar69);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar140,auVar79);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar140,auVar71);
  auVar81._8_4_ = 0x7fffffff;
  auVar81._0_8_ = 0x7fffffff7fffffff;
  auVar81._12_4_ = 0x7fffffff;
  auVar81._16_4_ = 0x7fffffff;
  auVar81._20_4_ = 0x7fffffff;
  auVar81._24_4_ = 0x7fffffff;
  auVar81._28_4_ = 0x7fffffff;
  auVar69 = vandps_avx(ZEXT1632(auVar38),auVar81);
  auVar83._8_4_ = 0x219392ef;
  auVar83._0_8_ = 0x219392ef219392ef;
  auVar83._12_4_ = 0x219392ef;
  auVar83._16_4_ = 0x219392ef;
  auVar83._20_4_ = 0x219392ef;
  auVar83._24_4_ = 0x219392ef;
  auVar83._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar69,auVar83,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar66._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._12_4_;
  auVar66._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar66._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar66._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar66._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar50),auVar81);
  uVar35 = vcmpps_avx512vl(auVar69,auVar83,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar63._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar63._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar63._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar63._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar50._12_4_;
  auVar63._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar63._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar63._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar63._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar69 = vandps_avx(ZEXT1632(auVar3),auVar81);
  uVar35 = vcmpps_avx512vl(auVar69,auVar83,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar69._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar3._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar3._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar3._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar3._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar68 = vrcp14ps_avx512vl(auVar66);
  auVar82._8_4_ = 0x3f800000;
  auVar82._0_8_ = &DAT_3f8000003f800000;
  auVar82._12_4_ = 0x3f800000;
  auVar82._16_4_ = 0x3f800000;
  auVar82._20_4_ = 0x3f800000;
  auVar82._24_4_ = 0x3f800000;
  auVar82._28_4_ = 0x3f800000;
  auVar38 = vfnmadd213ps_fma(auVar66,auVar68,auVar82);
  auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar63);
  auVar50 = vfnmadd213ps_fma(auVar63,auVar68,auVar82);
  auVar50 = vfmadd132ps_fma(ZEXT1632(auVar50),auVar68,auVar68);
  auVar68 = vrcp14ps_avx512vl(auVar69);
  auVar3 = vfnmadd213ps_fma(auVar69,auVar68,auVar82);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar68,auVar68);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar68 = vsubps_avx512vl(auVar69,auVar67);
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar71._4_4_ = auVar38._4_4_ * auVar68._4_4_;
  auVar71._0_4_ = auVar38._0_4_ * auVar68._0_4_;
  auVar71._8_4_ = auVar38._8_4_ * auVar68._8_4_;
  auVar71._12_4_ = auVar38._12_4_ * auVar68._12_4_;
  auVar71._16_4_ = auVar68._16_4_ * 0.0;
  auVar71._20_4_ = auVar68._20_4_ * 0.0;
  auVar71._24_4_ = auVar68._24_4_ * 0.0;
  auVar71._28_4_ = auVar68._28_4_;
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx512vl(auVar69,auVar67);
  auVar78._0_4_ = auVar38._0_4_ * auVar69._0_4_;
  auVar78._4_4_ = auVar38._4_4_ * auVar69._4_4_;
  auVar78._8_4_ = auVar38._8_4_ * auVar69._8_4_;
  auVar78._12_4_ = auVar38._12_4_ * auVar69._12_4_;
  auVar78._16_4_ = auVar69._16_4_ * 0.0;
  auVar78._20_4_ = auVar69._20_4_ * 0.0;
  auVar78._24_4_ = auVar69._24_4_ * 0.0;
  auVar78._28_4_ = 0;
  auVar67 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar6 * 0x10 + 6));
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar6 * 0x10 + uVar28 * -2 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar49));
  auVar72._4_4_ = auVar50._4_4_ * auVar69._4_4_;
  auVar72._0_4_ = auVar50._0_4_ * auVar69._0_4_;
  auVar72._8_4_ = auVar50._8_4_ * auVar69._8_4_;
  auVar72._12_4_ = auVar50._12_4_ * auVar69._12_4_;
  auVar72._16_4_ = auVar69._16_4_ * 0.0;
  auVar72._20_4_ = auVar69._20_4_ * 0.0;
  auVar72._24_4_ = auVar69._24_4_ * 0.0;
  auVar72._28_4_ = auVar69._28_4_;
  auVar69 = vcvtdq2ps_avx(auVar67);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar49));
  auVar76._0_4_ = auVar50._0_4_ * auVar69._0_4_;
  auVar76._4_4_ = auVar50._4_4_ * auVar69._4_4_;
  auVar76._8_4_ = auVar50._8_4_ * auVar69._8_4_;
  auVar76._12_4_ = auVar50._12_4_ * auVar69._12_4_;
  auVar76._16_4_ = auVar69._16_4_ * 0.0;
  auVar76._20_4_ = auVar69._20_4_ * 0.0;
  auVar76._24_4_ = auVar69._24_4_ * 0.0;
  auVar76._28_4_ = 0;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 + uVar28 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar48));
  auVar73._4_4_ = auVar69._4_4_ * auVar3._4_4_;
  auVar73._0_4_ = auVar69._0_4_ * auVar3._0_4_;
  auVar73._8_4_ = auVar69._8_4_ * auVar3._8_4_;
  auVar73._12_4_ = auVar69._12_4_ * auVar3._12_4_;
  auVar73._16_4_ = auVar69._16_4_ * 0.0;
  auVar73._20_4_ = auVar69._20_4_ * 0.0;
  auVar73._24_4_ = auVar69._24_4_ * 0.0;
  auVar73._28_4_ = auVar69._28_4_;
  auVar69 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x17 + 6));
  auVar69 = vcvtdq2ps_avx(auVar69);
  auVar69 = vsubps_avx(auVar69,ZEXT1632(auVar48));
  auVar64._0_4_ = auVar3._0_4_ * auVar69._0_4_;
  auVar64._4_4_ = auVar3._4_4_ * auVar69._4_4_;
  auVar64._8_4_ = auVar3._8_4_ * auVar69._8_4_;
  auVar64._12_4_ = auVar3._12_4_ * auVar69._12_4_;
  auVar64._16_4_ = auVar69._16_4_ * 0.0;
  auVar64._20_4_ = auVar69._20_4_ * 0.0;
  auVar64._24_4_ = auVar69._24_4_ * 0.0;
  auVar64._28_4_ = 0;
  auVar69 = vpminsd_avx2(auVar71,auVar78);
  auVar67 = vpminsd_avx2(auVar72,auVar76);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar67 = vpminsd_avx2(auVar73,auVar64);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar68._4_4_ = uVar107;
  auVar68._0_4_ = uVar107;
  auVar68._8_4_ = uVar107;
  auVar68._12_4_ = uVar107;
  auVar68._16_4_ = uVar107;
  auVar68._20_4_ = uVar107;
  auVar68._24_4_ = uVar107;
  auVar68._28_4_ = uVar107;
  auVar67 = vmaxps_avx512vl(auVar67,auVar68);
  auVar69 = vmaxps_avx(auVar69,auVar67);
  auVar67._8_4_ = 0x3f7ffffa;
  auVar67._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar67._12_4_ = 0x3f7ffffa;
  auVar67._16_4_ = 0x3f7ffffa;
  auVar67._20_4_ = 0x3f7ffffa;
  auVar67._24_4_ = 0x3f7ffffa;
  auVar67._28_4_ = 0x3f7ffffa;
  local_400 = vmulps_avx512vl(auVar69,auVar67);
  auVar69 = vpmaxsd_avx2(auVar71,auVar78);
  auVar67 = vpmaxsd_avx2(auVar72,auVar76);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar67 = vpmaxsd_avx2(auVar73,auVar64);
  uVar107 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar79._4_4_ = uVar107;
  auVar79._0_4_ = uVar107;
  auVar79._8_4_ = uVar107;
  auVar79._12_4_ = uVar107;
  auVar79._16_4_ = uVar107;
  auVar79._20_4_ = uVar107;
  auVar79._24_4_ = uVar107;
  auVar79._28_4_ = uVar107;
  auVar67 = vminps_avx512vl(auVar67,auVar79);
  auVar69 = vminps_avx(auVar69,auVar67);
  auVar80._8_4_ = 0x3f800003;
  auVar80._0_8_ = 0x3f8000033f800003;
  auVar80._12_4_ = 0x3f800003;
  auVar80._16_4_ = 0x3f800003;
  auVar80._20_4_ = 0x3f800003;
  auVar80._24_4_ = 0x3f800003;
  auVar80._28_4_ = 0x3f800003;
  auVar69 = vmulps_avx512vl(auVar69,auVar80);
  auVar67 = vpbroadcastd_avx512vl();
  uVar14 = vpcmpgtd_avx512vl(auVar67,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_400,auVar69,2);
  bVar36 = (byte)((byte)uVar12 & (byte)uVar14) == 0;
  local_771 = !bVar36;
  if (bVar36) {
    return local_771;
  }
  uVar35 = (ulong)(byte)((byte)uVar12 & (byte)uVar14);
  auVar104 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar104);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar255 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar104 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar249 = ZEXT1664(auVar38);
  auVar38 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar254 = ZEXT1664(auVar38);
LAB_01dda65e:
  lVar32 = 0;
  for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar32 = lVar32 + 1;
  }
  uVar34 = *(uint *)(prim + 2);
  pGVar8 = (context->scene->geometries).items[uVar34].ptr;
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar32 * 4 + 6));
  p_Var9 = pGVar8[1].intersectionFilterN;
  pvVar10 = pGVar8[2].userPtr;
  _Var11 = pGVar8[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(_Var11 + uVar28 * (long)pvVar10);
  auVar50 = *(undefined1 (*) [16])(_Var11 + (uVar28 + 1) * (long)pvVar10);
  auVar3 = *(undefined1 (*) [16])(_Var11 + (uVar28 + 2) * (long)pvVar10);
  auVar49 = *(undefined1 (*) [16])(_Var11 + (long)pvVar10 * (uVar28 + 3));
  lVar32 = *(long *)&pGVar8[1].time_range.upper;
  auVar48 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * uVar28);
  auVar47 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * (uVar28 + 1));
  auVar4 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * (uVar28 + 2));
  uVar35 = uVar35 - 1 & uVar35;
  auVar46 = *(undefined1 (*) [16])(lVar32 + (long)p_Var9 * (uVar28 + 3));
  if (uVar35 != 0) {
    uVar33 = uVar35 - 1 & uVar35;
    for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    }
    if (uVar33 != 0) {
      for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x1c
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
  auVar109 = auVar255._0_16_;
  auVar39 = vmulps_avx512vl(auVar46,auVar109);
  auVar41 = vfmadd213ps_fma((undefined1  [16])0x0,auVar4,auVar39);
  auVar40._0_4_ = auVar47._0_4_ + auVar41._0_4_;
  auVar40._4_4_ = auVar47._4_4_ + auVar41._4_4_;
  auVar40._8_4_ = auVar47._8_4_ + auVar41._8_4_;
  auVar40._12_4_ = auVar47._12_4_ + auVar41._12_4_;
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar48,auVar109);
  auVar51 = ZEXT816(0) << 0x40;
  auVar43._0_4_ = auVar46._0_4_ * 0.0;
  auVar43._4_4_ = auVar46._4_4_ * 0.0;
  auVar43._8_4_ = auVar46._8_4_ * 0.0;
  auVar43._12_4_ = auVar46._12_4_ * 0.0;
  auVar108 = auVar104._0_16_;
  auVar41 = vfmadd231ps_avx512vl(auVar43,auVar4,auVar108);
  auVar41 = vfmadd231ps_fma(auVar41,auVar47,auVar51);
  auVar42 = vfnmadd231ps_avx512vl(auVar41,auVar48,auVar108);
  auVar43 = vmulps_avx512vl(auVar49,auVar109);
  auVar41 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar3,auVar43);
  auVar235._0_4_ = auVar41._0_4_ + auVar50._0_4_;
  auVar235._4_4_ = auVar41._4_4_ + auVar50._4_4_;
  auVar235._8_4_ = auVar41._8_4_ + auVar50._8_4_;
  auVar235._12_4_ = auVar41._12_4_ + auVar50._12_4_;
  auVar44 = vfmadd231ps_avx512vl(auVar235,auVar38,auVar109);
  auVar240._0_4_ = auVar49._0_4_ * 0.0;
  auVar240._4_4_ = auVar49._4_4_ * 0.0;
  auVar240._8_4_ = auVar49._8_4_ * 0.0;
  auVar240._12_4_ = auVar49._12_4_ * 0.0;
  auVar41 = vfmadd231ps_avx512vl(auVar240,auVar3,auVar108);
  auVar41 = vfmadd231ps_fma(auVar41,auVar50,auVar51);
  auVar45 = vfnmadd231ps_avx512vl(auVar41,auVar38,auVar108);
  auVar54._0_4_ = auVar4._0_4_ + auVar39._0_4_;
  auVar54._4_4_ = auVar4._4_4_ + auVar39._4_4_;
  auVar54._8_4_ = auVar4._8_4_ + auVar39._8_4_;
  auVar54._12_4_ = auVar4._12_4_ + auVar39._12_4_;
  auVar41 = vfmadd231ps_fma(auVar54,auVar47,auVar51);
  auVar41 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar109);
  auVar46 = vmulps_avx512vl(auVar46,auVar108);
  auVar4 = vfmadd231ps_fma(auVar46,auVar51,auVar4);
  auVar47 = vfnmadd231ps_avx512vl(auVar4,auVar108,auVar47);
  auVar4 = vfmadd231ps_fma(auVar47,auVar51,auVar48);
  auVar187._0_4_ = auVar43._0_4_ + auVar3._0_4_;
  auVar187._4_4_ = auVar43._4_4_ + auVar3._4_4_;
  auVar187._8_4_ = auVar43._8_4_ + auVar3._8_4_;
  auVar187._12_4_ = auVar43._12_4_ + auVar3._12_4_;
  auVar48 = vfmadd231ps_fma(auVar187,auVar50,auVar51);
  auVar48 = vfmadd231ps_avx512vl(auVar48,auVar38,auVar109);
  auVar49 = vmulps_avx512vl(auVar49,auVar108);
  auVar3 = vfmadd231ps_fma(auVar49,auVar51,auVar3);
  auVar50 = vfnmadd231ps_avx512vl(auVar3,auVar108,auVar50);
  auVar47 = vfmadd231ps_fma(auVar50,auVar51,auVar38);
  auVar38 = vshufps_avx(auVar42,auVar42,0xc9);
  auVar50 = vshufps_avx(auVar44,auVar44,0xc9);
  fVar208 = auVar42._0_4_;
  auVar57._0_4_ = fVar208 * auVar50._0_4_;
  fVar209 = auVar42._4_4_;
  auVar57._4_4_ = fVar209 * auVar50._4_4_;
  fVar105 = auVar42._8_4_;
  auVar57._8_4_ = fVar105 * auVar50._8_4_;
  fVar106 = auVar42._12_4_;
  auVar57._12_4_ = fVar106 * auVar50._12_4_;
  auVar50 = vfmsub231ps_fma(auVar57,auVar38,auVar44);
  auVar3 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar58._0_4_ = fVar208 * auVar50._0_4_;
  auVar58._4_4_ = fVar209 * auVar50._4_4_;
  auVar58._8_4_ = fVar105 * auVar50._8_4_;
  auVar58._12_4_ = fVar106 * auVar50._12_4_;
  auVar38 = vfmsub231ps_fma(auVar58,auVar38,auVar45);
  auVar49 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar4,auVar4,0xc9);
  auVar50 = vshufps_avx(auVar48,auVar48,0xc9);
  fVar126 = auVar4._0_4_;
  auVar59._0_4_ = fVar126 * auVar50._0_4_;
  fVar142 = auVar4._4_4_;
  auVar59._4_4_ = fVar142 * auVar50._4_4_;
  fVar210 = auVar4._8_4_;
  auVar59._8_4_ = fVar210 * auVar50._8_4_;
  fVar211 = auVar4._12_4_;
  auVar59._12_4_ = fVar211 * auVar50._12_4_;
  auVar50 = vfmsub231ps_fma(auVar59,auVar38,auVar48);
  auVar48 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar50 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar188._0_4_ = auVar50._0_4_ * fVar126;
  auVar188._4_4_ = auVar50._4_4_ * fVar142;
  auVar188._8_4_ = auVar50._8_4_ * fVar210;
  auVar188._12_4_ = auVar50._12_4_ * fVar211;
  auVar38 = vfmsub231ps_fma(auVar188,auVar38,auVar47);
  auVar47 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vdpps_avx(auVar3,auVar3,0x7f);
  fVar102 = auVar38._0_4_;
  auVar189._4_12_ = ZEXT812(0) << 0x20;
  auVar189._0_4_ = fVar102;
  auVar50 = vrsqrt14ss_avx512f(auVar51,auVar189);
  auVar46 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar39 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  fVar213 = auVar50._0_4_;
  fVar213 = auVar46._0_4_ + auVar39._0_4_ * fVar213 * fVar213 * fVar213;
  fVar225 = fVar213 * auVar3._0_4_;
  fVar232 = fVar213 * auVar3._4_4_;
  fVar233 = fVar213 * auVar3._8_4_;
  fVar234 = fVar213 * auVar3._12_4_;
  auVar50 = vdpps_avx(auVar3,auVar49,0x7f);
  auVar198._0_4_ = auVar49._0_4_ * fVar102;
  auVar198._4_4_ = auVar49._4_4_ * fVar102;
  auVar198._8_4_ = auVar49._8_4_ * fVar102;
  auVar198._12_4_ = auVar49._12_4_ * fVar102;
  fVar102 = auVar50._0_4_;
  auVar157._0_4_ = fVar102 * auVar3._0_4_;
  auVar157._4_4_ = fVar102 * auVar3._4_4_;
  auVar157._8_4_ = fVar102 * auVar3._8_4_;
  auVar157._12_4_ = fVar102 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar198,auVar157);
  auVar50 = vrcp14ss_avx512f(auVar51,auVar189);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar50,ZEXT416(0x40000000));
  fVar212 = auVar50._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar48,auVar48,0x7f);
  fVar197 = auVar38._0_4_;
  auVar177._4_12_ = ZEXT812(0) << 0x20;
  auVar177._0_4_ = fVar197;
  auVar50 = vrsqrt14ss_avx512f(auVar51,auVar177);
  auVar49 = vmulss_avx512f(auVar50,ZEXT416(0x3fc00000));
  auVar46 = vmulss_avx512f(auVar38,ZEXT416(0xbf000000));
  fVar102 = auVar50._0_4_;
  fVar102 = auVar49._0_4_ + auVar46._0_4_ * fVar102 * fVar102 * fVar102;
  fVar214 = fVar102 * auVar48._0_4_;
  fVar222 = fVar102 * auVar48._4_4_;
  fVar223 = fVar102 * auVar48._8_4_;
  fVar224 = fVar102 * auVar48._12_4_;
  auVar50 = vdpps_avx(auVar48,auVar47,0x7f);
  auVar149._0_4_ = fVar197 * auVar47._0_4_;
  auVar149._4_4_ = fVar197 * auVar47._4_4_;
  auVar149._8_4_ = fVar197 * auVar47._8_4_;
  auVar149._12_4_ = fVar197 * auVar47._12_4_;
  fVar197 = auVar50._0_4_;
  auVar56._0_4_ = fVar197 * auVar48._0_4_;
  auVar56._4_4_ = fVar197 * auVar48._4_4_;
  auVar56._8_4_ = fVar197 * auVar48._8_4_;
  auVar56._12_4_ = fVar197 * auVar48._12_4_;
  auVar49 = vsubps_avx(auVar149,auVar56);
  auVar50 = vrcp14ss_avx512f(auVar51,auVar177);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar50,ZEXT416(0x40000000));
  fVar197 = auVar38._0_4_ * auVar50._0_4_;
  auVar38 = vshufps_avx(auVar40,auVar40,0xff);
  auVar178._0_4_ = fVar225 * auVar38._0_4_;
  auVar178._4_4_ = fVar232 * auVar38._4_4_;
  auVar178._8_4_ = fVar233 * auVar38._8_4_;
  auVar178._12_4_ = fVar234 * auVar38._12_4_;
  local_500 = vsubps_avx(auVar40,auVar178);
  auVar50 = vshufps_avx(auVar42,auVar42,0xff);
  auVar150._0_4_ = auVar50._0_4_ * fVar225 + auVar38._0_4_ * fVar213 * fVar212 * auVar3._0_4_;
  auVar150._4_4_ = auVar50._4_4_ * fVar232 + auVar38._4_4_ * fVar213 * fVar212 * auVar3._4_4_;
  auVar150._8_4_ = auVar50._8_4_ * fVar233 + auVar38._8_4_ * fVar213 * fVar212 * auVar3._8_4_;
  auVar150._12_4_ = auVar50._12_4_ * fVar234 + auVar38._12_4_ * fVar213 * fVar212 * auVar3._12_4_;
  auVar3 = vsubps_avx(auVar42,auVar150);
  local_510._0_4_ = auVar178._0_4_ + auVar40._0_4_;
  local_510._4_4_ = auVar178._4_4_ + auVar40._4_4_;
  fStack_508 = auVar178._8_4_ + auVar40._8_4_;
  fStack_504 = auVar178._12_4_ + auVar40._12_4_;
  auVar38 = vshufps_avx(auVar41,auVar41,0xff);
  auVar62._0_4_ = fVar214 * auVar38._0_4_;
  auVar62._4_4_ = fVar222 * auVar38._4_4_;
  auVar62._8_4_ = fVar223 * auVar38._8_4_;
  auVar62._12_4_ = fVar224 * auVar38._12_4_;
  local_520 = vsubps_avx(auVar41,auVar62);
  auVar50 = vshufps_avx(auVar4,auVar4,0xff);
  auVar44._0_4_ = auVar50._0_4_ * fVar214 + auVar38._0_4_ * fVar102 * auVar49._0_4_ * fVar197;
  auVar44._4_4_ = auVar50._4_4_ * fVar222 + auVar38._4_4_ * fVar102 * auVar49._4_4_ * fVar197;
  auVar44._8_4_ = auVar50._8_4_ * fVar223 + auVar38._8_4_ * fVar102 * auVar49._8_4_ * fVar197;
  auVar44._12_4_ = auVar50._12_4_ * fVar224 + auVar38._12_4_ * fVar102 * auVar49._12_4_ * fVar197;
  auVar38 = vsubps_avx(auVar4,auVar44);
  _local_530 = vaddps_avx512vl(auVar41,auVar62);
  auVar52._0_4_ = auVar3._0_4_ * 0.33333334;
  auVar52._4_4_ = auVar3._4_4_ * 0.33333334;
  auVar52._8_4_ = auVar3._8_4_ * 0.33333334;
  auVar52._12_4_ = auVar3._12_4_ * 0.33333334;
  local_540 = vaddps_avx512vl(local_500,auVar52);
  auVar53._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar53._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar53._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar53._12_4_ = auVar38._12_4_ * 0.33333334;
  local_550 = vsubps_avx512vl(local_520,auVar53);
  auVar41._0_4_ = (fVar208 + auVar150._0_4_) * 0.33333334;
  auVar41._4_4_ = (fVar209 + auVar150._4_4_) * 0.33333334;
  auVar41._8_4_ = (fVar105 + auVar150._8_4_) * 0.33333334;
  auVar41._12_4_ = (fVar106 + auVar150._12_4_) * 0.33333334;
  _local_560 = vaddps_avx512vl(_local_510,auVar41);
  auVar39._0_4_ = (fVar126 + auVar44._0_4_) * 0.33333334;
  auVar39._4_4_ = (fVar142 + auVar44._4_4_) * 0.33333334;
  auVar39._8_4_ = (fVar210 + auVar44._8_4_) * 0.33333334;
  auVar39._12_4_ = (fVar211 + auVar44._12_4_) * 0.33333334;
  _local_570 = vsubps_avx512vl(_local_530,auVar39);
  local_480 = vsubps_avx(local_500,auVar5);
  uVar107 = local_480._0_4_;
  auVar45._4_4_ = uVar107;
  auVar45._0_4_ = uVar107;
  auVar45._8_4_ = uVar107;
  auVar45._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_480,local_480,0x55);
  auVar50 = vshufps_avx(local_480,local_480,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar213 = pre->ray_space[k].vz.field_0.m128[0];
  fVar102 = pre->ray_space[k].vz.field_0.m128[1];
  fVar212 = pre->ray_space[k].vz.field_0.m128[2];
  fVar197 = pre->ray_space[k].vz.field_0.m128[3];
  auVar42._0_4_ = fVar213 * auVar50._0_4_;
  auVar42._4_4_ = fVar102 * auVar50._4_4_;
  auVar42._8_4_ = fVar212 * auVar50._8_4_;
  auVar42._12_4_ = fVar197 * auVar50._12_4_;
  auVar38 = vfmadd231ps_fma(auVar42,(undefined1  [16])aVar2,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar45);
  local_490 = vsubps_avx512vl(local_540,auVar5);
  uVar107 = local_490._0_4_;
  auVar60._4_4_ = uVar107;
  auVar60._0_4_ = uVar107;
  auVar60._8_4_ = uVar107;
  auVar60._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_490,local_490,0x55);
  auVar50 = vshufps_avx(local_490,local_490,0xaa);
  auVar55._0_4_ = fVar213 * auVar50._0_4_;
  auVar55._4_4_ = fVar102 * auVar50._4_4_;
  auVar55._8_4_ = fVar212 * auVar50._8_4_;
  auVar55._12_4_ = fVar197 * auVar50._12_4_;
  auVar38 = vfmadd231ps_fma(auVar55,(undefined1  [16])aVar2,auVar38);
  auVar39 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar60);
  local_4a0 = vsubps_avx512vl(local_550,auVar5);
  uVar107 = local_4a0._0_4_;
  auVar158._4_4_ = uVar107;
  auVar158._0_4_ = uVar107;
  auVar158._8_4_ = uVar107;
  auVar158._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_4a0,local_4a0,0x55);
  auVar50 = vshufps_avx(local_4a0,local_4a0,0xaa);
  auVar61._0_4_ = fVar213 * auVar50._0_4_;
  auVar61._4_4_ = fVar102 * auVar50._4_4_;
  auVar61._8_4_ = fVar212 * auVar50._8_4_;
  auVar61._12_4_ = fVar197 * auVar50._12_4_;
  auVar38 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar2,auVar38);
  auVar40 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar158);
  local_4b0 = vsubps_avx(local_520,auVar5);
  uVar107 = local_4b0._0_4_;
  auVar159._4_4_ = uVar107;
  auVar159._0_4_ = uVar107;
  auVar159._8_4_ = uVar107;
  auVar159._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_4b0,local_4b0,0x55);
  auVar50 = vshufps_avx(local_4b0,local_4b0,0xaa);
  auVar190._0_4_ = auVar50._0_4_ * fVar213;
  auVar190._4_4_ = auVar50._4_4_ * fVar102;
  auVar190._8_4_ = auVar50._8_4_ * fVar212;
  auVar190._12_4_ = auVar50._12_4_ * fVar197;
  auVar38 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar2,auVar38);
  auVar42 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar159);
  local_4c0 = vsubps_avx(_local_510,auVar5);
  uVar107 = local_4c0._0_4_;
  auVar160._4_4_ = uVar107;
  auVar160._0_4_ = uVar107;
  auVar160._8_4_ = uVar107;
  auVar160._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_4c0,local_4c0,0x55);
  auVar50 = vshufps_avx(local_4c0,local_4c0,0xaa);
  auVar199._0_4_ = auVar50._0_4_ * fVar213;
  auVar199._4_4_ = auVar50._4_4_ * fVar102;
  auVar199._8_4_ = auVar50._8_4_ * fVar212;
  auVar199._12_4_ = auVar50._12_4_ * fVar197;
  auVar38 = vfmadd231ps_fma(auVar199,(undefined1  [16])aVar2,auVar38);
  auVar43 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar160);
  local_4d0 = vsubps_avx512vl(_local_560,auVar5);
  uVar107 = local_4d0._0_4_;
  auVar161._4_4_ = uVar107;
  auVar161._0_4_ = uVar107;
  auVar161._8_4_ = uVar107;
  auVar161._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_4d0,local_4d0,0x55);
  auVar50 = vshufps_avx(local_4d0,local_4d0,0xaa);
  auVar215._0_4_ = auVar50._0_4_ * fVar213;
  auVar215._4_4_ = auVar50._4_4_ * fVar102;
  auVar215._8_4_ = auVar50._8_4_ * fVar212;
  auVar215._12_4_ = auVar50._12_4_ * fVar197;
  auVar38 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar2,auVar38);
  auVar44 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar161);
  local_4e0 = vsubps_avx512vl(_local_570,auVar5);
  uVar107 = local_4e0._0_4_;
  auVar162._4_4_ = uVar107;
  auVar162._0_4_ = uVar107;
  auVar162._8_4_ = uVar107;
  auVar162._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_4e0,local_4e0,0x55);
  auVar50 = vshufps_avx(local_4e0,local_4e0,0xaa);
  auVar226._0_4_ = auVar50._0_4_ * fVar213;
  auVar226._4_4_ = auVar50._4_4_ * fVar102;
  auVar226._8_4_ = auVar50._8_4_ * fVar212;
  auVar226._12_4_ = auVar50._12_4_ * fVar197;
  auVar38 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar2,auVar38);
  auVar45 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar162);
  local_4f0 = vsubps_avx512vl(_local_530,auVar5);
  uVar107 = local_4f0._0_4_;
  auVar51._4_4_ = uVar107;
  auVar51._0_4_ = uVar107;
  auVar51._8_4_ = uVar107;
  auVar51._12_4_ = uVar107;
  auVar38 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar50 = vshufps_avx(local_4f0,local_4f0,0xaa);
  auVar151._0_4_ = auVar50._0_4_ * fVar213;
  auVar151._4_4_ = auVar50._4_4_ * fVar102;
  auVar151._8_4_ = auVar50._8_4_ * fVar212;
  auVar151._12_4_ = auVar50._12_4_ * fVar197;
  auVar38 = vfmadd231ps_fma(auVar151,(undefined1  [16])aVar2,auVar38);
  auVar5 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar51);
  auVar3 = vmovlhps_avx(auVar41,auVar43);
  auVar47 = vmovlhps_avx512f(auVar39,auVar44);
  auVar4 = vmovlhps_avx512f(auVar40,auVar45);
  auVar46 = vmovlhps_avx512f(auVar42,auVar5);
  auVar38 = vminps_avx512vl(auVar3,auVar47);
  auVar49 = vmaxps_avx512vl(auVar3,auVar47);
  auVar50 = vminps_avx512vl(auVar4,auVar46);
  auVar50 = vminps_avx(auVar38,auVar50);
  auVar38 = vmaxps_avx512vl(auVar4,auVar46);
  auVar38 = vmaxps_avx(auVar49,auVar38);
  auVar49 = vshufpd_avx(auVar50,auVar50,3);
  auVar48 = vshufpd_avx(auVar38,auVar38,3);
  auVar50 = vminps_avx(auVar50,auVar49);
  auVar38 = vmaxps_avx(auVar38,auVar48);
  auVar50 = vandps_avx512vl(auVar50,auVar249._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar249._0_16_);
  auVar38 = vmaxps_avx(auVar50,auVar38);
  auVar50 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar50,auVar38);
  fVar102 = auVar38._0_4_ * 9.536743e-07;
  auVar163._8_8_ = auVar41._0_8_;
  auVar163._0_8_ = auVar41._0_8_;
  auVar50 = vmovddup_avx512vl(auVar39);
  auVar49 = vmovddup_avx512vl(auVar40);
  auVar108._8_8_ = auVar42._0_8_;
  auVar108._0_8_ = auVar42._0_8_;
  local_3c0 = vbroadcastss_avx512vl(ZEXT416((uint)fVar102));
  auVar38 = vxorps_avx512vl(local_3c0._0_16_,auVar109);
  local_3e0 = vbroadcastss_avx512vl(auVar38);
  auVar104 = vpbroadcastd_avx512f();
  local_300 = vmovdqa64_avx512f(auVar104);
  bVar36 = false;
  uVar28 = 0;
  fVar213 = *(float *)(ray + k * 4 + 0xc0);
  auVar48 = vsubps_avx512vl(auVar47,auVar3);
  auVar84._0_16_ = vsubps_avx512vl(auVar4,auVar47);
  local_470 = vsubps_avx512vl(auVar46,auVar4);
  local_580 = vsubps_avx(_local_510,local_500);
  local_590 = vsubps_avx512vl(_local_560,local_540);
  local_5a0 = vsubps_avx512vl(_local_570,local_550);
  _local_5b0 = vsubps_avx512vl(_local_530,local_520);
  auVar104 = vpbroadcastd_avx512f();
  local_340 = vmovdqa64_avx512f(auVar104);
  auVar38 = ZEXT816(0x3f80000000000000);
  auVar247 = ZEXT1664(auVar38);
  auVar98._32_32_ = auVar104._32_32_;
  do {
    auVar52 = auVar247._0_16_;
    auVar41 = vshufps_avx(auVar52,auVar52,0x50);
    auVar236._8_4_ = 0x3f800000;
    auVar236._0_8_ = &DAT_3f8000003f800000;
    auVar236._12_4_ = 0x3f800000;
    auVar239._16_4_ = 0x3f800000;
    auVar239._0_16_ = auVar236;
    auVar239._20_4_ = 0x3f800000;
    auVar239._24_4_ = 0x3f800000;
    auVar239._28_4_ = 0x3f800000;
    auVar39 = vsubps_avx(auVar236,auVar41);
    fVar212 = auVar41._0_4_;
    fVar224 = auVar43._0_4_;
    auVar127._0_4_ = fVar224 * fVar212;
    fVar197 = auVar41._4_4_;
    fVar225 = auVar43._4_4_;
    auVar127._4_4_ = fVar225 * fVar197;
    fVar208 = auVar41._8_4_;
    auVar127._8_4_ = fVar224 * fVar208;
    fVar209 = auVar41._12_4_;
    auVar127._12_4_ = fVar225 * fVar209;
    fVar105 = auVar44._0_4_;
    auVar136._0_4_ = fVar105 * fVar212;
    fVar106 = auVar44._4_4_;
    auVar136._4_4_ = fVar106 * fVar197;
    auVar136._8_4_ = fVar105 * fVar208;
    auVar136._12_4_ = fVar106 * fVar209;
    fVar126 = auVar45._0_4_;
    auVar143._0_4_ = fVar126 * fVar212;
    fVar142 = auVar45._4_4_;
    auVar143._4_4_ = fVar142 * fVar197;
    auVar143._8_4_ = fVar126 * fVar208;
    auVar143._12_4_ = fVar142 * fVar209;
    fVar222 = auVar5._0_4_;
    auVar109._0_4_ = fVar222 * fVar212;
    fVar223 = auVar5._4_4_;
    auVar109._4_4_ = fVar223 * fVar197;
    auVar109._8_4_ = fVar222 * fVar208;
    auVar109._12_4_ = fVar223 * fVar209;
    auVar40 = vfmadd231ps_fma(auVar127,auVar39,auVar163);
    auVar42 = vfmadd231ps_avx512vl(auVar136,auVar39,auVar50);
    auVar51 = vfmadd231ps_avx512vl(auVar143,auVar39,auVar49);
    auVar39 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar39);
    auVar41 = vmovshdup_avx(auVar38);
    fVar197 = auVar38._0_4_;
    fVar212 = (auVar41._0_4_ - fVar197) * 0.04761905;
    auVar175._4_4_ = fVar197;
    auVar175._0_4_ = fVar197;
    auVar175._8_4_ = fVar197;
    auVar175._12_4_ = fVar197;
    auVar175._16_4_ = fVar197;
    auVar175._20_4_ = fVar197;
    auVar175._24_4_ = fVar197;
    auVar175._28_4_ = fVar197;
    auVar123._0_8_ = auVar41._0_8_;
    auVar123._8_8_ = auVar123._0_8_;
    auVar123._16_8_ = auVar123._0_8_;
    auVar123._24_8_ = auVar123._0_8_;
    auVar69 = vsubps_avx(auVar123,auVar175);
    uVar107 = auVar40._0_4_;
    auVar124._4_4_ = uVar107;
    auVar124._0_4_ = uVar107;
    auVar124._8_4_ = uVar107;
    auVar124._12_4_ = uVar107;
    auVar124._16_4_ = uVar107;
    auVar124._20_4_ = uVar107;
    auVar124._24_4_ = uVar107;
    auVar124._28_4_ = uVar107;
    auVar194._8_4_ = 1;
    auVar194._0_8_ = 0x100000001;
    auVar194._12_4_ = 1;
    auVar194._16_4_ = 1;
    auVar194._20_4_ = 1;
    auVar194._24_4_ = 1;
    auVar194._28_4_ = 1;
    auVar79 = ZEXT1632(auVar40);
    auVar67 = vpermps_avx2(auVar194,auVar79);
    auVar68 = vbroadcastss_avx512vl(auVar42);
    auVar80 = ZEXT1632(auVar42);
    auVar70 = vpermps_avx512vl(auVar194,auVar80);
    auVar71 = vbroadcastss_avx512vl(auVar51);
    auVar64 = ZEXT1632(auVar51);
    auVar72 = vpermps_avx512vl(auVar194,auVar64);
    auVar73 = vbroadcastss_avx512vl(auVar39);
    auVar76 = ZEXT1632(auVar39);
    auVar74 = vpermps_avx512vl(auVar194,auVar76);
    auVar195._4_4_ = fVar212;
    auVar195._0_4_ = fVar212;
    auVar195._8_4_ = fVar212;
    auVar195._12_4_ = fVar212;
    auVar195._16_4_ = fVar212;
    auVar195._20_4_ = fVar212;
    auVar195._24_4_ = fVar212;
    auVar195._28_4_ = fVar212;
    auVar77 = auVar252._0_32_;
    auVar65 = vpermps_avx512vl(auVar77,auVar79);
    auVar155._8_4_ = 3;
    auVar155._0_8_ = 0x300000003;
    auVar155._12_4_ = 3;
    auVar155._16_4_ = 3;
    auVar155._20_4_ = 3;
    auVar155._24_4_ = 3;
    auVar155._28_4_ = 3;
    auVar66 = vpermps_avx512vl(auVar155,auVar79);
    auVar75 = vpermps_avx512vl(auVar77,auVar80);
    auVar79 = vpermps_avx2(auVar155,auVar80);
    auVar63 = vpermps_avx512vl(auVar77,auVar64);
    auVar80 = vpermps_avx2(auVar155,auVar64);
    auVar64 = vpermps_avx512vl(auVar77,auVar76);
    auVar76 = vpermps_avx512vl(auVar155,auVar76);
    auVar41 = vfmadd132ps_fma(auVar69,auVar175,_DAT_02020f20);
    auVar69 = vsubps_avx(auVar239,ZEXT1632(auVar41));
    auVar77 = vmulps_avx512vl(auVar68,ZEXT1632(auVar41));
    auVar81 = ZEXT1632(auVar41);
    auVar78 = vmulps_avx512vl(auVar70,auVar81);
    auVar39 = vfmadd231ps_fma(auVar77,auVar69,auVar124);
    auVar40 = vfmadd231ps_fma(auVar78,auVar69,auVar67);
    auVar77 = vmulps_avx512vl(auVar71,auVar81);
    auVar78 = vmulps_avx512vl(auVar72,auVar81);
    auVar68 = vfmadd231ps_avx512vl(auVar77,auVar69,auVar68);
    auVar70 = vfmadd231ps_avx512vl(auVar78,auVar69,auVar70);
    auVar77 = vmulps_avx512vl(auVar73,auVar81);
    auVar78 = ZEXT1632(auVar41);
    auVar74 = vmulps_avx512vl(auVar74,auVar78);
    auVar71 = vfmadd231ps_avx512vl(auVar77,auVar69,auVar71);
    auVar72 = vfmadd231ps_avx512vl(auVar74,auVar69,auVar72);
    fVar208 = auVar41._0_4_;
    fVar209 = auVar41._4_4_;
    auVar19._4_4_ = fVar209 * auVar68._4_4_;
    auVar19._0_4_ = fVar208 * auVar68._0_4_;
    fVar210 = auVar41._8_4_;
    auVar19._8_4_ = fVar210 * auVar68._8_4_;
    fVar211 = auVar41._12_4_;
    auVar19._12_4_ = fVar211 * auVar68._12_4_;
    auVar19._16_4_ = auVar68._16_4_ * 0.0;
    auVar19._20_4_ = auVar68._20_4_ * 0.0;
    auVar19._24_4_ = auVar68._24_4_ * 0.0;
    auVar19._28_4_ = fVar197;
    auVar20._4_4_ = fVar209 * auVar70._4_4_;
    auVar20._0_4_ = fVar208 * auVar70._0_4_;
    auVar20._8_4_ = fVar210 * auVar70._8_4_;
    auVar20._12_4_ = fVar211 * auVar70._12_4_;
    auVar20._16_4_ = auVar70._16_4_ * 0.0;
    auVar20._20_4_ = auVar70._20_4_ * 0.0;
    auVar20._24_4_ = auVar70._24_4_ * 0.0;
    auVar20._28_4_ = auVar67._28_4_;
    auVar39 = vfmadd231ps_fma(auVar19,auVar69,ZEXT1632(auVar39));
    auVar40 = vfmadd231ps_fma(auVar20,auVar69,ZEXT1632(auVar40));
    auVar115._0_4_ = fVar208 * auVar71._0_4_;
    auVar115._4_4_ = fVar209 * auVar71._4_4_;
    auVar115._8_4_ = fVar210 * auVar71._8_4_;
    auVar115._12_4_ = fVar211 * auVar71._12_4_;
    auVar115._16_4_ = auVar71._16_4_ * 0.0;
    auVar115._20_4_ = auVar71._20_4_ * 0.0;
    auVar115._24_4_ = auVar71._24_4_ * 0.0;
    auVar115._28_4_ = 0;
    auVar21._4_4_ = fVar209 * auVar72._4_4_;
    auVar21._0_4_ = fVar208 * auVar72._0_4_;
    auVar21._8_4_ = fVar210 * auVar72._8_4_;
    auVar21._12_4_ = fVar211 * auVar72._12_4_;
    auVar21._16_4_ = auVar72._16_4_ * 0.0;
    auVar21._20_4_ = auVar72._20_4_ * 0.0;
    auVar21._24_4_ = auVar72._24_4_ * 0.0;
    auVar21._28_4_ = auVar71._28_4_;
    auVar42 = vfmadd231ps_fma(auVar115,auVar69,auVar68);
    auVar51 = vfmadd231ps_fma(auVar21,auVar69,auVar70);
    auVar22._28_4_ = auVar70._28_4_;
    auVar22._0_28_ =
         ZEXT1628(CONCAT412(fVar211 * auVar51._12_4_,
                            CONCAT48(fVar210 * auVar51._8_4_,
                                     CONCAT44(fVar209 * auVar51._4_4_,fVar208 * auVar51._0_4_))));
    auVar55 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar211 * auVar42._12_4_,
                                                 CONCAT48(fVar210 * auVar42._8_4_,
                                                          CONCAT44(fVar209 * auVar42._4_4_,
                                                                   fVar208 * auVar42._0_4_)))),
                              auVar69,ZEXT1632(auVar39));
    auVar54 = vfmadd231ps_fma(auVar22,auVar69,ZEXT1632(auVar40));
    auVar67 = vsubps_avx(ZEXT1632(auVar42),ZEXT1632(auVar39));
    auVar68 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar40));
    auVar70 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar67 = vmulps_avx512vl(auVar67,auVar70);
    auVar68 = vmulps_avx512vl(auVar68,auVar70);
    auVar186._0_4_ = fVar212 * auVar67._0_4_;
    auVar186._4_4_ = fVar212 * auVar67._4_4_;
    auVar186._8_4_ = fVar212 * auVar67._8_4_;
    auVar186._12_4_ = fVar212 * auVar67._12_4_;
    auVar186._16_4_ = fVar212 * auVar67._16_4_;
    auVar186._20_4_ = fVar212 * auVar67._20_4_;
    auVar186._24_4_ = fVar212 * auVar67._24_4_;
    auVar186._28_4_ = 0;
    auVar67 = vmulps_avx512vl(auVar195,auVar68);
    auVar42 = vxorps_avx512vl(auVar73._0_16_,auVar73._0_16_);
    auVar68 = vpermt2ps_avx512vl(ZEXT1632(auVar55),_DAT_0205fd20,ZEXT1632(auVar42));
    auVar71 = vpermt2ps_avx512vl(ZEXT1632(auVar54),_DAT_0205fd20,ZEXT1632(auVar42));
    auVar116._0_4_ = auVar186._0_4_ + auVar55._0_4_;
    auVar116._4_4_ = auVar186._4_4_ + auVar55._4_4_;
    auVar116._8_4_ = auVar186._8_4_ + auVar55._8_4_;
    auVar116._12_4_ = auVar186._12_4_ + auVar55._12_4_;
    auVar116._16_4_ = auVar186._16_4_ + 0.0;
    auVar116._20_4_ = auVar186._20_4_ + 0.0;
    auVar116._24_4_ = auVar186._24_4_ + 0.0;
    auVar116._28_4_ = 0;
    auVar81 = ZEXT1632(auVar42);
    auVar72 = vpermt2ps_avx512vl(auVar186,_DAT_0205fd20,auVar81);
    auVar73 = vaddps_avx512vl(ZEXT1632(auVar54),auVar67);
    auVar74 = vpermt2ps_avx512vl(auVar67,_DAT_0205fd20,auVar81);
    auVar67 = vsubps_avx(auVar68,auVar72);
    auVar72 = vsubps_avx512vl(auVar71,auVar74);
    auVar74 = vmulps_avx512vl(auVar75,auVar78);
    auVar77 = vmulps_avx512vl(auVar79,auVar78);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar69,auVar65);
    auVar65 = vfmadd231ps_avx512vl(auVar77,auVar69,auVar66);
    auVar66 = vmulps_avx512vl(auVar63,auVar78);
    auVar77 = vmulps_avx512vl(auVar80,auVar78);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar69,auVar75);
    auVar79 = vfmadd231ps_avx512vl(auVar77,auVar69,auVar79);
    auVar75 = vmulps_avx512vl(auVar64,auVar78);
    auVar64 = vmulps_avx512vl(auVar76,auVar78);
    auVar39 = vfmadd231ps_fma(auVar75,auVar69,auVar63);
    auVar40 = vfmadd231ps_fma(auVar64,auVar69,auVar80);
    auVar75 = vmulps_avx512vl(auVar78,auVar66);
    auVar64 = vmulps_avx512vl(ZEXT1632(auVar41),auVar79);
    auVar74 = vfmadd231ps_avx512vl(auVar75,auVar69,auVar74);
    auVar65 = vfmadd231ps_avx512vl(auVar64,auVar69,auVar65);
    auVar66 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar211 * auVar39._12_4_,
                                            CONCAT48(fVar210 * auVar39._8_4_,
                                                     CONCAT44(fVar209 * auVar39._4_4_,
                                                              fVar208 * auVar39._0_4_)))),auVar69,
                         auVar66);
    auVar79 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar211 * auVar40._12_4_,
                                            CONCAT48(fVar210 * auVar40._8_4_,
                                                     CONCAT44(fVar209 * auVar40._4_4_,
                                                              fVar208 * auVar40._0_4_)))),auVar69,
                         auVar79);
    auVar23._4_4_ = fVar209 * auVar66._4_4_;
    auVar23._0_4_ = fVar208 * auVar66._0_4_;
    auVar23._8_4_ = fVar210 * auVar66._8_4_;
    auVar23._12_4_ = fVar211 * auVar66._12_4_;
    auVar23._16_4_ = auVar66._16_4_ * 0.0;
    auVar23._20_4_ = auVar66._20_4_ * 0.0;
    auVar23._24_4_ = auVar66._24_4_ * 0.0;
    auVar23._28_4_ = auVar80._28_4_;
    auVar24._4_4_ = fVar209 * auVar79._4_4_;
    auVar24._0_4_ = fVar208 * auVar79._0_4_;
    auVar24._8_4_ = fVar210 * auVar79._8_4_;
    auVar24._12_4_ = fVar211 * auVar79._12_4_;
    auVar24._16_4_ = auVar79._16_4_ * 0.0;
    auVar24._20_4_ = auVar79._20_4_ * 0.0;
    auVar24._24_4_ = auVar79._24_4_ * 0.0;
    auVar24._28_4_ = auVar63._28_4_;
    auVar80 = vfmadd231ps_avx512vl(auVar23,auVar69,auVar74);
    auVar75 = vfmadd231ps_avx512vl(auVar24,auVar65,auVar69);
    auVar69 = vsubps_avx512vl(auVar66,auVar74);
    auVar79 = vsubps_avx512vl(auVar79,auVar65);
    auVar69 = vmulps_avx512vl(auVar69,auVar70);
    auVar79 = vmulps_avx512vl(auVar79,auVar70);
    fVar197 = fVar212 * auVar69._0_4_;
    fVar208 = fVar212 * auVar69._4_4_;
    auVar25._4_4_ = fVar208;
    auVar25._0_4_ = fVar197;
    fVar209 = fVar212 * auVar69._8_4_;
    auVar25._8_4_ = fVar209;
    fVar210 = fVar212 * auVar69._12_4_;
    auVar25._12_4_ = fVar210;
    fVar211 = fVar212 * auVar69._16_4_;
    auVar25._16_4_ = fVar211;
    fVar214 = fVar212 * auVar69._20_4_;
    auVar25._20_4_ = fVar214;
    fVar212 = fVar212 * auVar69._24_4_;
    auVar25._24_4_ = fVar212;
    auVar25._28_4_ = auVar69._28_4_;
    auVar79 = vmulps_avx512vl(auVar195,auVar79);
    auVar70 = vpermt2ps_avx512vl(auVar80,_DAT_0205fd20,auVar81);
    auVar74 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,auVar81);
    auVar196._0_4_ = auVar80._0_4_ + fVar197;
    auVar196._4_4_ = auVar80._4_4_ + fVar208;
    auVar196._8_4_ = auVar80._8_4_ + fVar209;
    auVar196._12_4_ = auVar80._12_4_ + fVar210;
    auVar196._16_4_ = auVar80._16_4_ + fVar211;
    auVar196._20_4_ = auVar80._20_4_ + fVar214;
    auVar196._24_4_ = auVar80._24_4_ + fVar212;
    auVar196._28_4_ = auVar80._28_4_ + auVar69._28_4_;
    auVar69 = vpermt2ps_avx512vl(auVar25,_DAT_0205fd20,ZEXT1632(auVar42));
    auVar65 = vaddps_avx512vl(auVar75,auVar79);
    auVar79 = vpermt2ps_avx512vl(auVar79,_DAT_0205fd20,ZEXT1632(auVar42));
    auVar69 = vsubps_avx(auVar70,auVar69);
    auVar79 = vsubps_avx512vl(auVar74,auVar79);
    auVar133 = ZEXT1632(auVar55);
    auVar66 = vsubps_avx512vl(auVar80,auVar133);
    auVar140 = ZEXT1632(auVar54);
    auVar63 = vsubps_avx512vl(auVar75,auVar140);
    auVar64 = vsubps_avx512vl(auVar70,auVar68);
    auVar66 = vaddps_avx512vl(auVar66,auVar64);
    auVar64 = vsubps_avx512vl(auVar74,auVar71);
    auVar63 = vaddps_avx512vl(auVar63,auVar64);
    auVar64 = vmulps_avx512vl(auVar140,auVar66);
    auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar133,auVar63);
    auVar76 = vmulps_avx512vl(auVar73,auVar66);
    auVar76 = vfnmadd231ps_avx512vl(auVar76,auVar116,auVar63);
    auVar77 = vmulps_avx512vl(auVar72,auVar66);
    auVar77 = vfnmadd231ps_avx512vl(auVar77,auVar67,auVar63);
    auVar78 = vmulps_avx512vl(auVar71,auVar66);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar68,auVar63);
    auVar81 = vmulps_avx512vl(auVar75,auVar66);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar80,auVar63);
    auVar82 = vmulps_avx512vl(auVar65,auVar66);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar196,auVar63);
    auVar83 = vmulps_avx512vl(auVar79,auVar66);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar69,auVar63);
    auVar66 = vmulps_avx512vl(auVar74,auVar66);
    auVar66 = vfnmadd231ps_avx512vl(auVar66,auVar70,auVar63);
    auVar63 = vminps_avx512vl(auVar64,auVar76);
    auVar64 = vmaxps_avx512vl(auVar64,auVar76);
    auVar76 = vminps_avx512vl(auVar77,auVar78);
    auVar63 = vminps_avx512vl(auVar63,auVar76);
    auVar76 = vmaxps_avx512vl(auVar77,auVar78);
    auVar64 = vmaxps_avx512vl(auVar64,auVar76);
    auVar76 = vminps_avx512vl(auVar81,auVar82);
    auVar77 = vmaxps_avx512vl(auVar81,auVar82);
    auVar78 = vminps_avx512vl(auVar83,auVar66);
    auVar76 = vminps_avx512vl(auVar76,auVar78);
    auVar63 = vminps_avx512vl(auVar63,auVar76);
    auVar66 = vmaxps_avx512vl(auVar83,auVar66);
    auVar66 = vmaxps_avx512vl(auVar77,auVar66);
    auVar66 = vmaxps_avx512vl(auVar64,auVar66);
    uVar12 = vcmpps_avx512vl(auVar63,local_3c0,2);
    uVar14 = vcmpps_avx512vl(auVar66,local_3e0,5);
    uVar30 = 0;
    bVar26 = (byte)uVar12 & (byte)uVar14 & 0x7f;
    if (bVar26 != 0) {
      auVar66 = vsubps_avx512vl(auVar68,auVar133);
      auVar63 = vsubps_avx512vl(auVar71,auVar140);
      auVar64 = vsubps_avx512vl(auVar70,auVar80);
      auVar66 = vaddps_avx512vl(auVar66,auVar64);
      auVar64 = vsubps_avx512vl(auVar74,auVar75);
      auVar63 = vaddps_avx512vl(auVar63,auVar64);
      auVar64 = vmulps_avx512vl(auVar140,auVar66);
      auVar64 = vfnmadd231ps_avx512vl(auVar64,auVar63,auVar133);
      auVar73 = vmulps_avx512vl(auVar73,auVar66);
      auVar73 = vfnmadd213ps_avx512vl(auVar116,auVar63,auVar73);
      auVar72 = vmulps_avx512vl(auVar72,auVar66);
      auVar72 = vfnmadd213ps_avx512vl(auVar67,auVar63,auVar72);
      auVar67 = vmulps_avx512vl(auVar71,auVar66);
      auVar71 = vfnmadd231ps_avx512vl(auVar67,auVar63,auVar68);
      auVar67 = vmulps_avx512vl(auVar75,auVar66);
      auVar80 = vfnmadd231ps_avx512vl(auVar67,auVar63,auVar80);
      auVar67 = vmulps_avx512vl(auVar65,auVar66);
      auVar65 = vfnmadd213ps_avx512vl(auVar196,auVar63,auVar67);
      auVar67 = vmulps_avx512vl(auVar79,auVar66);
      auVar75 = vfnmadd213ps_avx512vl(auVar69,auVar63,auVar67);
      auVar69 = vmulps_avx512vl(auVar74,auVar66);
      auVar70 = vfnmadd231ps_avx512vl(auVar69,auVar70,auVar63);
      auVar67 = vminps_avx(auVar64,auVar73);
      auVar69 = vmaxps_avx(auVar64,auVar73);
      auVar68 = vminps_avx(auVar72,auVar71);
      auVar68 = vminps_avx(auVar67,auVar68);
      auVar67 = vmaxps_avx(auVar72,auVar71);
      auVar69 = vmaxps_avx(auVar69,auVar67);
      auVar79 = vminps_avx(auVar80,auVar65);
      auVar67 = vmaxps_avx(auVar80,auVar65);
      auVar80 = vminps_avx(auVar75,auVar70);
      auVar79 = vminps_avx(auVar79,auVar80);
      auVar79 = vminps_avx(auVar68,auVar79);
      auVar68 = vmaxps_avx(auVar75,auVar70);
      auVar67 = vmaxps_avx(auVar67,auVar68);
      auVar69 = vmaxps_avx(auVar69,auVar67);
      uVar12 = vcmpps_avx512vl(auVar69,local_3e0,5);
      uVar14 = vcmpps_avx512vl(auVar79,local_3c0,2);
      uVar30 = (uint)(bVar26 & (byte)uVar12 & (byte)uVar14);
    }
    if (uVar30 != 0) {
      auStack_5f0[uVar28] = uVar30;
      uVar12 = vmovlps_avx(auVar38);
      *(undefined8 *)(&uStack_460 + uVar28 * 2) = uVar12;
      uVar33 = vmovlps_avx512f(auVar52);
      auStack_3a0[uVar28] = uVar33;
      uVar28 = (ulong)((int)uVar28 + 1);
    }
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar104 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar249 = ZEXT1664(auVar38);
    auVar247._0_32_ = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar247._32_32_ = auVar98._32_32_;
    auVar248 = ZEXT3264(auVar247._0_32_);
    auVar250 = ZEXT464(0x3f800000);
    auVar84._16_48_ = auVar247._16_48_;
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar251 = ZEXT1664(auVar38);
    auVar99 = auVar84;
    do {
      auVar38 = auVar251._0_16_;
      if ((int)uVar28 == 0) {
        if (bVar36) {
          return local_771;
        }
        uVar107 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar18._4_4_ = uVar107;
        auVar18._0_4_ = uVar107;
        auVar18._8_4_ = uVar107;
        auVar18._12_4_ = uVar107;
        auVar18._16_4_ = uVar107;
        auVar18._20_4_ = uVar107;
        auVar18._24_4_ = uVar107;
        auVar18._28_4_ = uVar107;
        uVar12 = vcmpps_avx512vl(local_400,auVar18,2);
        uVar34 = (uint)uVar35 & (uint)uVar12;
        uVar35 = (ulong)uVar34;
        local_771 = uVar34 != 0;
        if (!local_771) {
          return local_771;
        }
        goto LAB_01dda65e;
      }
      uVar27 = (int)uVar28 - 1;
      uVar29 = (ulong)uVar27;
      uVar30 = (&uStack_460)[uVar29 * 2];
      fVar212 = afStack_45c[uVar29 * 2];
      uVar7 = auStack_5f0[uVar29];
      auVar245._8_8_ = 0;
      auVar245._0_8_ = auStack_3a0[uVar29];
      auVar247 = ZEXT1664(auVar245);
      lVar32 = 0;
      for (uVar33 = (ulong)uVar7; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar32 = lVar32 + 1;
      }
      uVar31 = uVar7 - 1 & uVar7;
      auStack_5f0[uVar29] = uVar31;
      if (uVar31 == 0) {
        uVar28 = (ulong)uVar27;
      }
      auVar117._0_4_ = (float)lVar32;
      auVar117._4_8_ = SUB128(ZEXT812(0),4);
      auVar117._12_4_ = 0;
      auVar98._32_32_ = auVar99._32_32_;
      auVar39 = vmulss_avx512f(auVar117,SUB6416(ZEXT464(0x3e124925),0));
      lVar32 = lVar32 + 1;
      auVar51 = auVar255._0_16_;
      auVar41 = vcvtsi2ss_avx512f(auVar51,lVar32);
      auVar41 = vmulss_avx512f(auVar41,SUB6416(ZEXT464(0x3e124925),0));
      auVar42 = auVar250._0_16_;
      auVar40 = vsubss_avx512f(auVar42,auVar39);
      auVar39 = vmulss_avx512f(ZEXT416((uint)fVar212),auVar39);
      auVar100._0_16_ = vfmadd231ss_avx512f(auVar39,ZEXT416(uVar30),auVar40);
      auVar39 = vsubss_avx512f(auVar42,auVar41);
      auVar41 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar41._0_4_)),ZEXT416(uVar30),auVar39);
      auVar39 = vsubss_avx512f(auVar41,auVar100._0_16_);
      vucomiss_avx512f(auVar39);
      if (uVar7 == 0 || lVar32 == 0) break;
      auVar40 = vshufps_avx(auVar245,auVar245,0x50);
      vucomiss_avx512f(auVar39);
      auVar52 = vsubps_avx512vl(auVar38,auVar40);
      fVar212 = auVar40._0_4_;
      auVar128._0_4_ = fVar224 * fVar212;
      fVar197 = auVar40._4_4_;
      auVar128._4_4_ = fVar225 * fVar197;
      fVar208 = auVar40._8_4_;
      auVar128._8_4_ = fVar224 * fVar208;
      fVar209 = auVar40._12_4_;
      auVar128._12_4_ = fVar225 * fVar209;
      auVar137._0_4_ = fVar105 * fVar212;
      auVar137._4_4_ = fVar106 * fVar197;
      auVar137._8_4_ = fVar105 * fVar208;
      auVar137._12_4_ = fVar106 * fVar209;
      auVar144._0_4_ = fVar126 * fVar212;
      auVar144._4_4_ = fVar142 * fVar197;
      auVar144._8_4_ = fVar126 * fVar208;
      auVar144._12_4_ = fVar142 * fVar209;
      auVar110._0_4_ = fVar222 * fVar212;
      auVar110._4_4_ = fVar223 * fVar197;
      auVar110._8_4_ = fVar222 * fVar208;
      auVar110._12_4_ = fVar223 * fVar209;
      auVar40 = vfmadd231ps_fma(auVar128,auVar52,auVar163);
      auVar55 = vfmadd231ps_fma(auVar137,auVar52,auVar50);
      auVar54 = vfmadd231ps_fma(auVar144,auVar52,auVar49);
      auVar53 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar52);
      auVar125._16_16_ = auVar40;
      auVar125._0_16_ = auVar40;
      auVar134._16_16_ = auVar55;
      auVar134._0_16_ = auVar55;
      auVar141._16_16_ = auVar54;
      auVar141._0_16_ = auVar54;
      auVar156._0_4_ = auVar100._0_4_;
      auVar156._4_4_ = auVar156._0_4_;
      auVar156._8_4_ = auVar156._0_4_;
      auVar156._12_4_ = auVar156._0_4_;
      uVar107 = auVar41._0_4_;
      auVar156._20_4_ = uVar107;
      auVar156._16_4_ = uVar107;
      auVar156._24_4_ = uVar107;
      auVar156._28_4_ = uVar107;
      auVar69 = vsubps_avx(auVar134,auVar125);
      auVar55 = vfmadd213ps_fma(auVar69,auVar156,auVar125);
      auVar69 = vsubps_avx(auVar141,auVar134);
      auVar52 = vfmadd213ps_fma(auVar69,auVar156,auVar134);
      auVar40 = vsubps_avx(auVar53,auVar54);
      auVar135._16_16_ = auVar40;
      auVar135._0_16_ = auVar40;
      auVar40 = vfmadd213ps_fma(auVar135,auVar156,auVar141);
      auVar69 = vsubps_avx(ZEXT1632(auVar52),ZEXT1632(auVar55));
      auVar55 = vfmadd213ps_fma(auVar69,auVar156,ZEXT1632(auVar55));
      auVar69 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar52));
      auVar40 = vfmadd213ps_fma(auVar69,auVar156,ZEXT1632(auVar52));
      auVar69 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar55));
      auVar62 = vfmadd231ps_fma(ZEXT1632(auVar55),auVar69,auVar156);
      auVar98._0_32_ = vmulps_avx512vl(auVar69,auVar248._0_32_);
      auVar86._16_48_ = auVar98._16_48_;
      auVar40 = vmulss_avx512f(auVar39,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar212 = auVar40._0_4_;
      auVar145._0_8_ =
           CONCAT44(auVar62._4_4_ + fVar212 * auVar98._4_4_,auVar62._0_4_ + fVar212 * auVar98._0_4_)
      ;
      auVar145._8_4_ = auVar62._8_4_ + fVar212 * auVar98._8_4_;
      auVar145._12_4_ = auVar62._12_4_ + fVar212 * auVar98._12_4_;
      auVar129._0_4_ = fVar212 * auVar98._16_4_;
      auVar129._4_4_ = fVar212 * auVar98._20_4_;
      auVar129._8_4_ = fVar212 * auVar98._24_4_;
      auVar129._12_4_ = fVar212 * auVar98._28_4_;
      auVar149 = vsubps_avx((undefined1  [16])0x0,auVar129);
      auVar61 = vshufpd_avx(auVar62,auVar62,3);
      auVar59 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar40 = vsubps_avx(auVar61,auVar62);
      auVar55 = vsubps_avx(auVar59,(undefined1  [16])0x0);
      auVar164._0_4_ = auVar55._0_4_ + auVar40._0_4_;
      auVar164._4_4_ = auVar55._4_4_ + auVar40._4_4_;
      auVar164._8_4_ = auVar55._8_4_ + auVar40._8_4_;
      auVar164._12_4_ = auVar55._12_4_ + auVar40._12_4_;
      auVar40 = vshufps_avx(auVar62,auVar62,0xb1);
      auVar55 = vshufps_avx(auVar145,auVar145,0xb1);
      auVar54 = vshufps_avx(auVar149,auVar149,0xb1);
      auVar52 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar227._4_4_ = auVar164._0_4_;
      auVar227._0_4_ = auVar164._0_4_;
      auVar227._8_4_ = auVar164._0_4_;
      auVar227._12_4_ = auVar164._0_4_;
      auVar53 = vshufps_avx(auVar164,auVar164,0x55);
      fVar212 = auVar53._0_4_;
      auVar179._0_4_ = auVar40._0_4_ * fVar212;
      fVar197 = auVar53._4_4_;
      auVar179._4_4_ = auVar40._4_4_ * fVar197;
      fVar208 = auVar53._8_4_;
      auVar179._8_4_ = auVar40._8_4_ * fVar208;
      fVar209 = auVar53._12_4_;
      auVar179._12_4_ = auVar40._12_4_ * fVar209;
      auVar191._0_4_ = auVar55._0_4_ * fVar212;
      auVar191._4_4_ = auVar55._4_4_ * fVar197;
      auVar191._8_4_ = auVar55._8_4_ * fVar208;
      auVar191._12_4_ = auVar55._12_4_ * fVar209;
      auVar200._0_4_ = auVar54._0_4_ * fVar212;
      auVar200._4_4_ = auVar54._4_4_ * fVar197;
      auVar200._8_4_ = auVar54._8_4_ * fVar208;
      auVar200._12_4_ = auVar54._12_4_ * fVar209;
      auVar165._0_4_ = auVar52._0_4_ * fVar212;
      auVar165._4_4_ = auVar52._4_4_ * fVar197;
      auVar165._8_4_ = auVar52._8_4_ * fVar208;
      auVar165._12_4_ = auVar52._12_4_ * fVar209;
      auVar40 = vfmadd231ps_fma(auVar179,auVar227,auVar62);
      auVar55 = vfmadd231ps_fma(auVar191,auVar227,auVar145);
      auVar53 = vfmadd231ps_fma(auVar200,auVar227,auVar149);
      auVar150 = vfmadd231ps_fma(auVar165,(undefined1  [16])0x0,auVar227);
      auVar60 = vshufpd_avx(auVar40,auVar40,1);
      auVar56 = vshufpd_avx(auVar55,auVar55,1);
      auVar57 = vshufpd_avx(auVar53,auVar53,1);
      auVar58 = vshufpd_avx(auVar150,auVar150,1);
      auVar54 = vminss_avx(auVar40,auVar55);
      auVar40 = vmaxss_avx(auVar55,auVar40);
      auVar52 = vminss_avx(auVar53,auVar150);
      auVar55 = vmaxss_avx(auVar150,auVar53);
      auVar52 = vminss_avx(auVar54,auVar52);
      auVar40 = vmaxss_avx(auVar55,auVar40);
      auVar53 = vminss_avx(auVar60,auVar56);
      auVar55 = vmaxss_avx(auVar56,auVar60);
      auVar60 = vminss_avx(auVar57,auVar58);
      auVar54 = vmaxss_avx(auVar58,auVar57);
      auVar53 = vminss_avx(auVar53,auVar60);
      auVar55 = vmaxss_avx(auVar54,auVar55);
      fVar208 = auVar52._0_4_;
      fVar197 = auVar55._0_4_;
      fVar212 = auVar40._0_4_;
      if ((0.0001 <= fVar208) || (fVar197 <= -0.0001)) {
        uVar12 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar14 = vcmpps_avx512vl(auVar52,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar212 & ((byte)uVar14 | (byte)uVar12)) != 0) goto LAB_01ddb598;
        uVar12 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar55,5);
        uVar14 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar14 | (ushort)uVar12) & 1) == 0) goto LAB_01ddb598;
        bVar13 = true;
        auVar247 = ZEXT1664(auVar245);
        auVar100._16_48_ = auVar86._16_48_;
        auVar99 = auVar100;
      }
      else {
LAB_01ddb598:
        auVar56 = auVar254._0_16_;
        uVar12 = vcmpss_avx512f(auVar52,auVar56,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        iVar101 = auVar250._0_4_;
        fVar209 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        uVar12 = vcmpss_avx512f(auVar40,auVar56,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar210 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        bVar13 = fVar209 != fVar210;
        iVar253 = auVar254._0_4_;
        auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar85._4_60_ = auVar86._4_60_;
        auVar85._0_4_ = (uint)bVar13 * iVar253 + (uint)!bVar13 * 0x7f800000;
        auVar60 = auVar85._0_16_;
        auVar88._16_48_ = auVar86._16_48_;
        auVar88._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar87._4_60_ = auVar88._4_60_;
        auVar87._0_4_ = (uint)bVar13 * iVar253 + (uint)!bVar13 * -0x800000;
        auVar54 = auVar87._0_16_;
        uVar12 = vcmpss_avx512f(auVar53,auVar56,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar211 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        if ((fVar209 != fVar211) || (NAN(fVar209) || NAN(fVar211))) {
          fVar209 = auVar53._0_4_;
          bVar13 = fVar209 == fVar208;
          if ((!bVar13) || (NAN(fVar209) || NAN(fVar208))) {
            auVar17._8_4_ = 0x80000000;
            auVar17._0_8_ = 0x8000000080000000;
            auVar17._12_4_ = 0x80000000;
            auVar52 = vxorps_avx512vl(auVar52,auVar17);
            auVar241._0_4_ = auVar52._0_4_ / (fVar209 - fVar208);
            auVar241._4_12_ = auVar52._4_12_;
            auVar52 = vsubss_avx512f(auVar42,auVar241);
            auVar53 = vfmadd213ss_avx512f(auVar52,auVar56,auVar241);
            auVar52 = auVar53;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar90._16_48_ = auVar86._16_48_;
            auVar90._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar89._4_60_ = auVar90._4_60_;
            auVar89._0_4_ = (uint)bVar13 * iVar253 + (uint)!bVar13 * 0x7f800000;
            auVar53 = auVar89._0_16_;
            auVar52 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar60 = vminss_avx(auVar60,auVar53);
          auVar54 = vmaxss_avx(auVar52,auVar54);
        }
        auVar247 = ZEXT1664(auVar245);
        uVar12 = vcmpss_avx512f(auVar55,auVar56,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar208 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar101);
        if ((fVar210 != fVar208) || (NAN(fVar210) || NAN(fVar208))) {
          bVar13 = fVar197 == fVar212;
          if ((!bVar13) || (NAN(fVar197) || NAN(fVar212))) {
            auVar16._8_4_ = 0x80000000;
            auVar16._0_8_ = 0x8000000080000000;
            auVar16._12_4_ = 0x80000000;
            auVar40 = vxorps_avx512vl(auVar40,auVar16);
            auVar201._0_4_ = auVar40._0_4_ / (fVar197 - fVar212);
            auVar201._4_12_ = auVar40._4_12_;
            auVar40 = vsubss_avx512f(auVar42,auVar201);
            auVar55 = vfmadd213ss_avx512f(auVar40,auVar56,auVar201);
            auVar40 = auVar55;
          }
          else {
            vucomiss_avx512f(auVar56);
            auVar92._16_48_ = auVar86._16_48_;
            auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar91._4_60_ = auVar92._4_60_;
            auVar91._0_4_ = (uint)bVar13 * iVar253 + (uint)!bVar13 * 0x7f800000;
            auVar55 = auVar91._0_16_;
            auVar40 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar60 = vminss_avx(auVar60,auVar55);
          auVar54 = vmaxss_avx(auVar40,auVar54);
        }
        bVar13 = fVar211 != fVar208;
        auVar40 = vminss_avx512f(auVar60,auVar42);
        auVar94._16_48_ = auVar86._16_48_;
        auVar94._0_16_ = auVar60;
        auVar93._4_60_ = auVar94._4_60_;
        auVar93._0_4_ = (uint)bVar13 * auVar40._0_4_ + (uint)!bVar13 * auVar60._0_4_;
        auVar40 = vmaxss_avx512f(auVar42,auVar54);
        auVar96._16_48_ = auVar86._16_48_;
        auVar96._0_16_ = auVar54;
        auVar95._4_60_ = auVar96._4_60_;
        auVar95._0_4_ = (uint)bVar13 * auVar40._0_4_ + (uint)!bVar13 * auVar54._0_4_;
        auVar40 = vmaxss_avx512f(auVar56,auVar93._0_16_);
        auVar55 = vminss_avx512f(auVar95._0_16_,auVar42);
        bVar13 = true;
        if (auVar40._0_4_ <= auVar55._0_4_) {
          auVar56 = vmaxss_avx512f(auVar56,ZEXT416((uint)(auVar40._0_4_ + -0.1)));
          auVar57 = vminss_avx512f(ZEXT416((uint)(auVar55._0_4_ + 0.1)),auVar42);
          auVar111._0_8_ = auVar62._0_8_;
          auVar111._8_8_ = auVar111._0_8_;
          auVar192._8_8_ = auVar145._0_8_;
          auVar192._0_8_ = auVar145._0_8_;
          auVar202._8_8_ = auVar149._0_8_;
          auVar202._0_8_ = auVar149._0_8_;
          auVar40 = vshufpd_avx(auVar145,auVar145,3);
          auVar55 = vshufpd_avx(auVar149,auVar149,3);
          auVar54 = vshufps_avx(auVar56,auVar57,0);
          auVar58 = vsubps_avx512vl(auVar38,auVar54);
          fVar212 = auVar54._0_4_;
          auVar237._0_4_ = fVar212 * auVar61._0_4_;
          fVar197 = auVar54._4_4_;
          auVar237._4_4_ = fVar197 * auVar61._4_4_;
          fVar208 = auVar54._8_4_;
          auVar237._8_4_ = fVar208 * auVar61._8_4_;
          fVar209 = auVar54._12_4_;
          auVar237._12_4_ = fVar209 * auVar61._12_4_;
          auVar146._0_4_ = fVar212 * auVar40._0_4_;
          auVar146._4_4_ = fVar197 * auVar40._4_4_;
          auVar146._8_4_ = fVar208 * auVar40._8_4_;
          auVar146._12_4_ = fVar209 * auVar40._12_4_;
          auVar152._0_4_ = fVar212 * auVar55._0_4_;
          auVar152._4_4_ = fVar197 * auVar55._4_4_;
          auVar152._8_4_ = fVar208 * auVar55._8_4_;
          auVar152._12_4_ = fVar209 * auVar55._12_4_;
          auVar130._0_4_ = fVar212 * auVar59._0_4_;
          auVar130._4_4_ = fVar197 * auVar59._4_4_;
          auVar130._8_4_ = fVar208 * auVar59._8_4_;
          auVar130._12_4_ = fVar209 * auVar59._12_4_;
          auVar52 = vfmadd231ps_fma(auVar237,auVar58,auVar111);
          auVar53 = vfmadd231ps_fma(auVar146,auVar58,auVar192);
          auVar60 = vfmadd231ps_fma(auVar152,auVar58,auVar202);
          auVar61 = vfmadd231ps_fma(auVar130,auVar58,ZEXT816(0));
          auVar55 = vsubss_avx512f(auVar42,auVar56);
          auVar40 = vmovshdup_avx(auVar245);
          auVar149 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * auVar56._0_4_)),auVar245,auVar55
                                    );
          auVar55 = vsubss_avx512f(auVar42,auVar57);
          auVar150 = vfmadd231ss_fma(ZEXT416((uint)(auVar57._0_4_ * auVar40._0_4_)),auVar245,auVar55
                                    );
          auVar59 = vdivss_avx512f(auVar42,auVar39);
          auVar39 = vsubps_avx(auVar53,auVar52);
          auVar118._0_4_ = auVar39._0_4_ * 3.0;
          auVar118._4_4_ = auVar39._4_4_ * 3.0;
          auVar118._8_4_ = auVar39._8_4_ * 3.0;
          auVar118._12_4_ = auVar39._12_4_ * 3.0;
          auVar39 = vsubps_avx(auVar60,auVar53);
          auVar166._0_4_ = auVar39._0_4_ * 3.0;
          auVar166._4_4_ = auVar39._4_4_ * 3.0;
          auVar166._8_4_ = auVar39._8_4_ * 3.0;
          auVar166._12_4_ = auVar39._12_4_ * 3.0;
          auVar39 = vsubps_avx(auVar61,auVar60);
          auVar180._0_4_ = auVar39._0_4_ * 3.0;
          auVar180._4_4_ = auVar39._4_4_ * 3.0;
          auVar180._8_4_ = auVar39._8_4_ * 3.0;
          auVar180._12_4_ = auVar39._12_4_ * 3.0;
          auVar40 = vminps_avx(auVar166,auVar180);
          auVar39 = vmaxps_avx(auVar166,auVar180);
          auVar40 = vminps_avx(auVar118,auVar40);
          auVar39 = vmaxps_avx(auVar118,auVar39);
          auVar55 = vshufpd_avx(auVar40,auVar40,3);
          auVar54 = vshufpd_avx(auVar39,auVar39,3);
          auVar40 = vminps_avx(auVar40,auVar55);
          auVar39 = vmaxps_avx(auVar39,auVar54);
          fVar212 = auVar59._0_4_;
          auVar181._0_4_ = fVar212 * auVar40._0_4_;
          auVar181._4_4_ = fVar212 * auVar40._4_4_;
          auVar181._8_4_ = fVar212 * auVar40._8_4_;
          auVar181._12_4_ = fVar212 * auVar40._12_4_;
          auVar167._0_4_ = fVar212 * auVar39._0_4_;
          auVar167._4_4_ = fVar212 * auVar39._4_4_;
          auVar167._8_4_ = fVar212 * auVar39._8_4_;
          auVar167._12_4_ = fVar212 * auVar39._12_4_;
          auVar59 = vdivss_avx512f(auVar42,ZEXT416((uint)(auVar150._0_4_ - auVar149._0_4_)));
          auVar39 = vshufpd_avx(auVar52,auVar52,3);
          auVar40 = vshufpd_avx(auVar53,auVar53,3);
          auVar55 = vshufpd_avx(auVar60,auVar60,3);
          auVar54 = vshufpd_avx(auVar61,auVar61,3);
          auVar39 = vsubps_avx(auVar39,auVar52);
          auVar52 = vsubps_avx(auVar40,auVar53);
          auVar53 = vsubps_avx(auVar55,auVar60);
          auVar54 = vsubps_avx(auVar54,auVar61);
          auVar40 = vminps_avx(auVar39,auVar52);
          auVar39 = vmaxps_avx(auVar39,auVar52);
          auVar55 = vminps_avx(auVar53,auVar54);
          auVar55 = vminps_avx(auVar40,auVar55);
          auVar40 = vmaxps_avx(auVar53,auVar54);
          auVar39 = vmaxps_avx(auVar39,auVar40);
          fVar212 = auVar59._0_4_;
          auVar203._0_4_ = fVar212 * auVar55._0_4_;
          auVar203._4_4_ = fVar212 * auVar55._4_4_;
          auVar203._8_4_ = fVar212 * auVar55._8_4_;
          auVar203._12_4_ = fVar212 * auVar55._12_4_;
          auVar216._0_4_ = fVar212 * auVar39._0_4_;
          auVar216._4_4_ = fVar212 * auVar39._4_4_;
          auVar216._8_4_ = fVar212 * auVar39._8_4_;
          auVar216._12_4_ = fVar212 * auVar39._12_4_;
          auVar58 = vinsertps_avx512f(auVar100._0_16_,auVar149,0x10);
          auVar54 = vinsertps_avx(auVar41,auVar150,0x10);
          auVar103._0_4_ = auVar58._0_4_ + auVar54._0_4_;
          auVar103._4_4_ = auVar58._4_4_ + auVar54._4_4_;
          auVar103._8_4_ = auVar58._8_4_ + auVar54._8_4_;
          auVar103._12_4_ = auVar58._12_4_ + auVar54._12_4_;
          auVar56 = vmulps_avx512vl(auVar103,auVar104._0_16_);
          auVar55 = vshufps_avx(auVar56,auVar56,0x54);
          uVar107 = auVar56._0_4_;
          auVar119._4_4_ = uVar107;
          auVar119._0_4_ = uVar107;
          auVar119._8_4_ = uVar107;
          auVar119._12_4_ = uVar107;
          auVar53 = vfmadd213ps_avx512vl(auVar48,auVar119,auVar3);
          auVar40 = vfmadd213ps_fma(auVar84._0_16_,auVar119,auVar47);
          auVar52 = vfmadd213ps_fma(local_470,auVar119,auVar4);
          auVar39 = vsubps_avx(auVar40,auVar53);
          auVar53 = vfmadd213ps_fma(auVar39,auVar119,auVar53);
          auVar39 = vsubps_avx(auVar52,auVar40);
          auVar39 = vfmadd213ps_fma(auVar39,auVar119,auVar40);
          auVar39 = vsubps_avx(auVar39,auVar53);
          auVar40 = vfmadd231ps_fma(auVar53,auVar39,auVar119);
          auVar120._0_8_ = CONCAT44(auVar39._4_4_ * 3.0,auVar39._0_4_ * 3.0);
          auVar120._8_4_ = auVar39._8_4_ * 3.0;
          auVar120._12_4_ = auVar39._12_4_ * 3.0;
          auVar228._8_8_ = auVar40._0_8_;
          auVar228._0_8_ = auVar40._0_8_;
          auVar39 = vshufpd_avx(auVar40,auVar40,3);
          auVar40 = vshufps_avx(auVar56,auVar56,0x55);
          auVar52 = vsubps_avx(auVar39,auVar228);
          auVar53 = vfmadd231ps_fma(auVar228,auVar40,auVar52);
          auVar242._8_8_ = auVar120._0_8_;
          auVar242._0_8_ = auVar120._0_8_;
          auVar39 = vshufpd_avx(auVar120,auVar120,3);
          auVar39 = vsubps_avx(auVar39,auVar242);
          auVar40 = vfmadd213ps_fma(auVar39,auVar40,auVar242);
          auVar60 = vxorps_avx512vl(auVar52,auVar51);
          auVar39 = vmovshdup_avx(auVar40);
          auVar51 = vxorps_avx512vl(auVar39,auVar51);
          auVar61 = vmovshdup_avx512vl(auVar52);
          auVar51 = vpermt2ps_avx512vl(auVar51,ZEXT416(5),auVar52);
          auVar39 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar39._0_4_ * auVar52._0_4_)),auVar40,
                                        auVar61);
          auVar40 = vpermt2ps_avx512vl(auVar40,SUB6416(ZEXT464(4),0),auVar60);
          auVar131._0_4_ = auVar39._0_4_;
          auVar131._4_4_ = auVar131._0_4_;
          auVar131._8_4_ = auVar131._0_4_;
          auVar131._12_4_ = auVar131._0_4_;
          auVar39 = vdivps_avx(auVar51,auVar131);
          auVar40 = vdivps_avx(auVar40,auVar131);
          fVar197 = auVar53._0_4_;
          auVar51 = vshufps_avx(auVar53,auVar53,0x55);
          fVar212 = auVar40._0_4_;
          auVar229._0_4_ = fVar197 * auVar39._0_4_ + auVar51._0_4_ * fVar212;
          auVar229._4_4_ = fVar197 * auVar39._4_4_ + auVar51._4_4_ * auVar40._4_4_;
          auVar229._8_4_ = fVar197 * auVar39._8_4_ + auVar51._8_4_ * auVar40._8_4_;
          auVar229._12_4_ = fVar197 * auVar39._12_4_ + auVar51._12_4_ * auVar40._12_4_;
          auVar57 = vsubps_avx(auVar55,auVar229);
          auVar52 = vmovshdup_avx(auVar39);
          auVar51 = vinsertps_avx(auVar181,auVar203,0x1c);
          auVar243._0_4_ = auVar52._0_4_ * auVar51._0_4_;
          auVar243._4_4_ = auVar52._4_4_ * auVar51._4_4_;
          auVar243._8_4_ = auVar52._8_4_ * auVar51._8_4_;
          auVar243._12_4_ = auVar52._12_4_ * auVar51._12_4_;
          auVar55 = vinsertps_avx(auVar167,auVar216,0x1c);
          auVar230._0_4_ = auVar52._0_4_ * auVar55._0_4_;
          auVar230._4_4_ = auVar52._4_4_ * auVar55._4_4_;
          auVar230._8_4_ = auVar52._8_4_ * auVar55._8_4_;
          auVar230._12_4_ = auVar52._12_4_ * auVar55._12_4_;
          auVar59 = vminps_avx512vl(auVar243,auVar230);
          auVar60 = vmaxps_avx(auVar230,auVar243);
          auVar61 = vmovshdup_avx(auVar40);
          auVar52 = vinsertps_avx(auVar203,auVar181,0x4c);
          auVar204._0_4_ = auVar61._0_4_ * auVar52._0_4_;
          auVar204._4_4_ = auVar61._4_4_ * auVar52._4_4_;
          auVar204._8_4_ = auVar61._8_4_ * auVar52._8_4_;
          auVar204._12_4_ = auVar61._12_4_ * auVar52._12_4_;
          auVar53 = vinsertps_avx(auVar216,auVar167,0x4c);
          auVar217._0_4_ = auVar61._0_4_ * auVar53._0_4_;
          auVar217._4_4_ = auVar61._4_4_ * auVar53._4_4_;
          auVar217._8_4_ = auVar61._8_4_ * auVar53._8_4_;
          auVar217._12_4_ = auVar61._12_4_ * auVar53._12_4_;
          auVar61 = vminps_avx(auVar204,auVar217);
          auVar59 = vaddps_avx512vl(auVar59,auVar61);
          auVar61 = vmaxps_avx(auVar217,auVar204);
          auVar205._0_4_ = auVar60._0_4_ + auVar61._0_4_;
          auVar205._4_4_ = auVar60._4_4_ + auVar61._4_4_;
          auVar205._8_4_ = auVar60._8_4_ + auVar61._8_4_;
          auVar205._12_4_ = auVar60._12_4_ + auVar61._12_4_;
          auVar218._8_8_ = 0x3f80000000000000;
          auVar218._0_8_ = 0x3f80000000000000;
          auVar60 = vsubps_avx(auVar218,auVar205);
          auVar61 = vsubps_avx(auVar218,auVar59);
          auVar59 = vsubps_avx(auVar58,auVar56);
          auVar56 = vsubps_avx(auVar54,auVar56);
          fVar211 = auVar59._0_4_;
          auVar244._0_4_ = fVar211 * auVar60._0_4_;
          fVar214 = auVar59._4_4_;
          auVar244._4_4_ = fVar214 * auVar60._4_4_;
          fVar232 = auVar59._8_4_;
          auVar244._8_4_ = fVar232 * auVar60._8_4_;
          fVar233 = auVar59._12_4_;
          auVar244._12_4_ = fVar233 * auVar60._12_4_;
          auVar62 = vbroadcastss_avx512vl(auVar39);
          auVar51 = vmulps_avx512vl(auVar62,auVar51);
          auVar55 = vmulps_avx512vl(auVar62,auVar55);
          auVar62 = vminps_avx512vl(auVar51,auVar55);
          auVar51 = vmaxps_avx(auVar55,auVar51);
          auVar182._0_4_ = fVar212 * auVar52._0_4_;
          auVar182._4_4_ = fVar212 * auVar52._4_4_;
          auVar182._8_4_ = fVar212 * auVar52._8_4_;
          auVar182._12_4_ = fVar212 * auVar52._12_4_;
          auVar168._0_4_ = fVar212 * auVar53._0_4_;
          auVar168._4_4_ = fVar212 * auVar53._4_4_;
          auVar168._8_4_ = fVar212 * auVar53._8_4_;
          auVar168._12_4_ = fVar212 * auVar53._12_4_;
          auVar55 = vminps_avx(auVar182,auVar168);
          auVar52 = vaddps_avx512vl(auVar62,auVar55);
          auVar53 = vmulps_avx512vl(auVar59,auVar61);
          fVar197 = auVar56._0_4_;
          auVar206._0_4_ = fVar197 * auVar60._0_4_;
          fVar208 = auVar56._4_4_;
          auVar206._4_4_ = fVar208 * auVar60._4_4_;
          fVar209 = auVar56._8_4_;
          auVar206._8_4_ = fVar209 * auVar60._8_4_;
          fVar210 = auVar56._12_4_;
          auVar206._12_4_ = fVar210 * auVar60._12_4_;
          auVar219._0_4_ = fVar197 * auVar61._0_4_;
          auVar219._4_4_ = fVar208 * auVar61._4_4_;
          auVar219._8_4_ = fVar209 * auVar61._8_4_;
          auVar219._12_4_ = fVar210 * auVar61._12_4_;
          auVar55 = vmaxps_avx(auVar168,auVar182);
          auVar169._0_4_ = auVar51._0_4_ + auVar55._0_4_;
          auVar169._4_4_ = auVar51._4_4_ + auVar55._4_4_;
          auVar169._8_4_ = auVar51._8_4_ + auVar55._8_4_;
          auVar169._12_4_ = auVar51._12_4_ + auVar55._12_4_;
          auVar183._8_8_ = 0x3f800000;
          auVar183._0_8_ = 0x3f800000;
          auVar51 = vsubps_avx(auVar183,auVar169);
          auVar55 = vsubps_avx(auVar183,auVar52);
          auVar238._0_4_ = fVar211 * auVar51._0_4_;
          auVar238._4_4_ = fVar214 * auVar51._4_4_;
          auVar238._8_4_ = fVar232 * auVar51._8_4_;
          auVar238._12_4_ = fVar233 * auVar51._12_4_;
          auVar231._0_4_ = fVar211 * auVar55._0_4_;
          auVar231._4_4_ = fVar214 * auVar55._4_4_;
          auVar231._8_4_ = fVar232 * auVar55._8_4_;
          auVar231._12_4_ = fVar233 * auVar55._12_4_;
          auVar170._0_4_ = fVar197 * auVar51._0_4_;
          auVar170._4_4_ = fVar208 * auVar51._4_4_;
          auVar170._8_4_ = fVar209 * auVar51._8_4_;
          auVar170._12_4_ = fVar210 * auVar51._12_4_;
          auVar184._0_4_ = fVar197 * auVar55._0_4_;
          auVar184._4_4_ = fVar208 * auVar55._4_4_;
          auVar184._8_4_ = fVar209 * auVar55._8_4_;
          auVar184._12_4_ = fVar210 * auVar55._12_4_;
          auVar51 = vminps_avx(auVar238,auVar231);
          auVar55 = vminps_avx(auVar170,auVar184);
          auVar52 = vminps_avx(auVar51,auVar55);
          auVar51 = vmaxps_avx(auVar231,auVar238);
          auVar55 = vmaxps_avx(auVar184,auVar170);
          auVar55 = vmaxps_avx(auVar55,auVar51);
          auVar60 = vminps_avx512vl(auVar244,auVar53);
          auVar51 = vminps_avx(auVar206,auVar219);
          auVar51 = vminps_avx(auVar60,auVar51);
          auVar51 = vhaddps_avx(auVar52,auVar51);
          auVar53 = vmaxps_avx512vl(auVar53,auVar244);
          auVar52 = vmaxps_avx(auVar219,auVar206);
          auVar52 = vmaxps_avx(auVar52,auVar53);
          auVar55 = vhaddps_avx(auVar55,auVar52);
          auVar51 = vshufps_avx(auVar51,auVar51,0xe8);
          auVar55 = vshufps_avx(auVar55,auVar55,0xe8);
          auVar171._0_4_ = auVar51._0_4_ + auVar57._0_4_;
          auVar171._4_4_ = auVar51._4_4_ + auVar57._4_4_;
          auVar171._8_4_ = auVar51._8_4_ + auVar57._8_4_;
          auVar171._12_4_ = auVar51._12_4_ + auVar57._12_4_;
          auVar185._0_4_ = auVar55._0_4_ + auVar57._0_4_;
          auVar185._4_4_ = auVar55._4_4_ + auVar57._4_4_;
          auVar185._8_4_ = auVar55._8_4_ + auVar57._8_4_;
          auVar185._12_4_ = auVar55._12_4_ + auVar57._12_4_;
          auVar51 = vmaxps_avx(auVar58,auVar171);
          auVar55 = vminps_avx(auVar185,auVar54);
          uVar33 = vcmpps_avx512vl(auVar55,auVar51,1);
          auVar51 = vinsertps_avx(auVar149,auVar150,0x10);
          auVar247 = ZEXT1664(auVar51);
          auVar55 = ZEXT416(5);
          if ((uVar33 & 3) == 0) {
            vucomiss_avx512f(auVar100._0_16_);
            auVar97._0_16_ = vxorps_avx512vl(auVar55,auVar55);
            auVar97._16_48_ = auVar86._16_48_;
            auVar254 = ZEXT1664(auVar97._0_16_);
            local_630 = auVar46._0_4_;
            fStack_62c = auVar46._4_4_;
            fStack_628 = auVar46._8_4_;
            fStack_624 = auVar46._12_4_;
            if ((uint)uVar28 < 4 && (uVar7 == 0 || lVar32 == 0)) {
              bVar13 = false;
              auVar99 = auVar97;
            }
            else {
              lVar32 = 200;
              auVar99 = auVar97;
              do {
                auVar55 = vsubss_avx512f(auVar42,auVar57);
                fVar209 = auVar55._0_4_;
                fVar197 = fVar209 * fVar209 * fVar209;
                fVar210 = auVar57._0_4_;
                fVar208 = fVar210 * 3.0 * fVar209 * fVar209;
                fVar209 = fVar209 * fVar210 * fVar210 * 3.0;
                auVar147._4_4_ = fVar197;
                auVar147._0_4_ = fVar197;
                auVar147._8_4_ = fVar197;
                auVar147._12_4_ = fVar197;
                auVar138._4_4_ = fVar208;
                auVar138._0_4_ = fVar208;
                auVar138._8_4_ = fVar208;
                auVar138._12_4_ = fVar208;
                auVar112._4_4_ = fVar209;
                auVar112._0_4_ = fVar209;
                auVar112._8_4_ = fVar209;
                auVar112._12_4_ = fVar209;
                fVar210 = fVar210 * fVar210 * fVar210;
                auVar153._0_4_ = local_630 * fVar210;
                auVar153._4_4_ = fStack_62c * fVar210;
                auVar153._8_4_ = fStack_628 * fVar210;
                auVar153._12_4_ = fStack_624 * fVar210;
                auVar55 = vfmadd231ps_fma(auVar153,auVar4,auVar112);
                auVar55 = vfmadd231ps_fma(auVar55,auVar47,auVar138);
                auVar55 = vfmadd231ps_fma(auVar55,auVar3,auVar147);
                auVar113._8_8_ = auVar55._0_8_;
                auVar113._0_8_ = auVar55._0_8_;
                auVar55 = vshufpd_avx(auVar55,auVar55,3);
                auVar54 = vshufps_avx(auVar57,auVar57,0x55);
                auVar55 = vsubps_avx(auVar55,auVar113);
                auVar54 = vfmadd213ps_fma(auVar55,auVar54,auVar113);
                fVar197 = auVar54._0_4_;
                auVar55 = vshufps_avx(auVar54,auVar54,0x55);
                auVar114._0_4_ = auVar39._0_4_ * fVar197 + fVar212 * auVar55._0_4_;
                auVar114._4_4_ = auVar39._4_4_ * fVar197 + auVar40._4_4_ * auVar55._4_4_;
                auVar114._8_4_ = auVar39._8_4_ * fVar197 + auVar40._8_4_ * auVar55._8_4_;
                auVar114._12_4_ = auVar39._12_4_ * fVar197 + auVar40._12_4_ * auVar55._12_4_;
                auVar57 = vsubps_avx(auVar57,auVar114);
                auVar55 = vandps_avx512vl(auVar54,auVar249._0_16_);
                auVar99._0_16_ = vprolq_avx512vl(auVar55,0x20);
                auVar55 = vmaxss_avx(auVar99._0_16_,auVar55);
                bVar37 = auVar55._0_4_ <= fVar102;
                if (auVar55._0_4_ < fVar102) {
                  auVar39 = vucomiss_avx512f(auVar97._0_16_);
                  if (bVar37) {
                    auVar40 = vucomiss_avx512f(auVar39);
                    auVar250 = ZEXT1664(auVar40);
                    if (bVar37) {
                      vmovshdup_avx(auVar39);
                      auVar40 = vucomiss_avx512f(auVar97._0_16_);
                      if (bVar37) {
                        auVar42 = vucomiss_avx512f(auVar40);
                        auVar250 = ZEXT1664(auVar42);
                        if (bVar37) {
                          auVar55 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar56 = vinsertps_avx(auVar55,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar55 = vdpps_avx(auVar56,local_480,0x7f);
                          auVar54 = vdpps_avx(auVar56,local_490,0x7f);
                          auVar52 = vdpps_avx(auVar56,local_4a0,0x7f);
                          auVar53 = vdpps_avx(auVar56,local_4b0,0x7f);
                          auVar60 = vdpps_avx(auVar56,local_4c0,0x7f);
                          auVar61 = vdpps_avx(auVar56,local_4d0,0x7f);
                          auVar59 = vdpps_avx(auVar56,local_4e0,0x7f);
                          auVar56 = vdpps_avx(auVar56,local_4f0,0x7f);
                          auVar57 = vsubss_avx512f(auVar42,auVar40);
                          fVar212 = auVar40._0_4_;
                          auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar60._0_4_)),auVar57
                                                    ,auVar55);
                          auVar55 = vfmadd231ss_fma(ZEXT416((uint)(auVar61._0_4_ * fVar212)),auVar57
                                                    ,auVar54);
                          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(auVar59._0_4_ * fVar212)),auVar57
                                                    ,auVar52);
                          auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar212 * auVar56._0_4_)),auVar57
                                                    ,auVar53);
                          auVar99._0_16_ = vsubss_avx512f(auVar42,auVar39);
                          auVar154._0_4_ = auVar99._0_4_;
                          fVar212 = auVar154._0_4_ * auVar154._0_4_ * auVar154._0_4_;
                          fVar209 = auVar39._0_4_;
                          fVar197 = fVar209 * 3.0 * auVar154._0_4_ * auVar154._0_4_;
                          fVar208 = auVar154._0_4_ * fVar209 * fVar209 * 3.0;
                          fVar211 = fVar209 * fVar209 * fVar209;
                          auVar42 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * auVar52._0_4_)),
                                                    ZEXT416((uint)fVar208),auVar54);
                          auVar42 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar197),auVar55);
                          auVar40 = vfmadd231ss_fma(auVar42,ZEXT416((uint)fVar212),auVar40);
                          fVar210 = auVar40._0_4_;
                          if ((fVar213 <= fVar210) &&
                             (fVar214 = *(float *)(ray + k * 4 + 0x200), fVar210 <= fVar214)) {
                            auVar40 = vshufps_avx(auVar39,auVar39,0x55);
                            auVar55 = vsubps_avx512vl(auVar38,auVar40);
                            fVar232 = auVar40._0_4_;
                            auVar193._0_4_ = fVar232 * (float)local_510._0_4_;
                            fVar233 = auVar40._4_4_;
                            auVar193._4_4_ = fVar233 * (float)local_510._4_4_;
                            fVar234 = auVar40._8_4_;
                            auVar193._8_4_ = fVar234 * fStack_508;
                            fVar176 = auVar40._12_4_;
                            auVar193._12_4_ = fVar176 * fStack_504;
                            auVar207._0_4_ = fVar232 * (float)local_560._0_4_;
                            auVar207._4_4_ = fVar233 * (float)local_560._4_4_;
                            auVar207._8_4_ = fVar234 * fStack_558;
                            auVar207._12_4_ = fVar176 * fStack_554;
                            auVar220._0_4_ = fVar232 * (float)local_570._0_4_;
                            auVar220._4_4_ = fVar233 * (float)local_570._4_4_;
                            auVar220._8_4_ = fVar234 * fStack_568;
                            auVar220._12_4_ = fVar176 * fStack_564;
                            auVar172._0_4_ = fVar232 * (float)local_530._0_4_;
                            auVar172._4_4_ = fVar233 * (float)local_530._4_4_;
                            auVar172._8_4_ = fVar234 * fStack_528;
                            auVar172._12_4_ = fVar176 * fStack_524;
                            auVar38 = vfmadd231ps_fma(auVar193,auVar55,local_500);
                            auVar40 = vfmadd231ps_fma(auVar207,auVar55,local_540);
                            auVar42 = vfmadd231ps_fma(auVar220,auVar55,local_550);
                            auVar55 = vfmadd231ps_fma(auVar172,auVar55,local_520);
                            auVar38 = vsubps_avx(auVar40,auVar38);
                            auVar40 = vsubps_avx(auVar42,auVar40);
                            auVar42 = vsubps_avx(auVar55,auVar42);
                            auVar221._0_4_ = fVar209 * auVar40._0_4_;
                            auVar221._4_4_ = fVar209 * auVar40._4_4_;
                            auVar221._8_4_ = fVar209 * auVar40._8_4_;
                            auVar221._12_4_ = fVar209 * auVar40._12_4_;
                            auVar154._4_4_ = auVar154._0_4_;
                            auVar154._8_4_ = auVar154._0_4_;
                            auVar154._12_4_ = auVar154._0_4_;
                            auVar38 = vfmadd231ps_fma(auVar221,auVar154,auVar38);
                            auVar173._0_4_ = fVar209 * auVar42._0_4_;
                            auVar173._4_4_ = fVar209 * auVar42._4_4_;
                            auVar173._8_4_ = fVar209 * auVar42._8_4_;
                            auVar173._12_4_ = fVar209 * auVar42._12_4_;
                            auVar40 = vfmadd231ps_fma(auVar173,auVar154,auVar40);
                            auVar174._0_4_ = fVar209 * auVar40._0_4_;
                            auVar174._4_4_ = fVar209 * auVar40._4_4_;
                            auVar174._8_4_ = fVar209 * auVar40._8_4_;
                            auVar174._12_4_ = fVar209 * auVar40._12_4_;
                            auVar38 = vfmadd231ps_fma(auVar174,auVar154,auVar38);
                            auVar15._8_4_ = 0x40400000;
                            auVar15._0_8_ = 0x4040000040400000;
                            auVar15._12_4_ = 0x40400000;
                            auVar99._0_16_ = vmulps_avx512vl(auVar38,auVar15);
                            pGVar8 = (context->scene->geometries).items[uVar34].ptr;
                            if ((pGVar8->mask & *(uint *)(ray + k * 4 + 0x240)) == 0) {
                              bVar37 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar37 = true,
                                    pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar148._0_4_ = fVar211 * (float)local_5b0._0_4_;
                              auVar148._4_4_ = fVar211 * (float)local_5b0._4_4_;
                              auVar148._8_4_ = fVar211 * fStack_5a8;
                              auVar148._12_4_ = fVar211 * fStack_5a4;
                              auVar139._4_4_ = fVar208;
                              auVar139._0_4_ = fVar208;
                              auVar139._8_4_ = fVar208;
                              auVar139._12_4_ = fVar208;
                              auVar38 = vfmadd132ps_fma(auVar139,auVar148,local_5a0);
                              auVar132._4_4_ = fVar197;
                              auVar132._0_4_ = fVar197;
                              auVar132._8_4_ = fVar197;
                              auVar132._12_4_ = fVar197;
                              auVar38 = vfmadd132ps_fma(auVar132,auVar38,local_590);
                              auVar121._4_4_ = fVar212;
                              auVar121._0_4_ = fVar212;
                              auVar121._8_4_ = fVar212;
                              auVar121._12_4_ = fVar212;
                              auVar42 = vfmadd132ps_fma(auVar121,auVar38,local_580);
                              auVar38 = vshufps_avx(auVar42,auVar42,0xc9);
                              auVar40 = vshufps_avx(auVar99._0_16_,auVar99._0_16_,0xc9);
                              auVar122._0_4_ = auVar42._0_4_ * auVar40._0_4_;
                              auVar122._4_4_ = auVar42._4_4_ * auVar40._4_4_;
                              auVar122._8_4_ = auVar42._8_4_ * auVar40._8_4_;
                              auVar122._12_4_ = auVar42._12_4_ * auVar40._12_4_;
                              auVar38 = vfmsub231ps_fma(auVar122,auVar99._0_16_,auVar38);
                              local_200 = vbroadcastss_avx512f(auVar39);
                              auVar98 = vbroadcastss_avx512f(ZEXT416(1));
                              local_1c0 = vpermps_avx512f(auVar98,ZEXT1664(auVar39));
                              auVar98 = vpermps_avx512f(auVar98,ZEXT1664(auVar38));
                              auVar247 = vbroadcastss_avx512f(ZEXT416(2));
                              local_280 = vpermps_avx512f(auVar247,ZEXT1664(auVar38));
                              local_240 = vbroadcastss_avx512f(auVar38);
                              local_2c0[0] = (RTCHitN)auVar98[0];
                              local_2c0[1] = (RTCHitN)auVar98[1];
                              local_2c0[2] = (RTCHitN)auVar98[2];
                              local_2c0[3] = (RTCHitN)auVar98[3];
                              local_2c0[4] = (RTCHitN)auVar98[4];
                              local_2c0[5] = (RTCHitN)auVar98[5];
                              local_2c0[6] = (RTCHitN)auVar98[6];
                              local_2c0[7] = (RTCHitN)auVar98[7];
                              local_2c0[8] = (RTCHitN)auVar98[8];
                              local_2c0[9] = (RTCHitN)auVar98[9];
                              local_2c0[10] = (RTCHitN)auVar98[10];
                              local_2c0[0xb] = (RTCHitN)auVar98[0xb];
                              local_2c0[0xc] = (RTCHitN)auVar98[0xc];
                              local_2c0[0xd] = (RTCHitN)auVar98[0xd];
                              local_2c0[0xe] = (RTCHitN)auVar98[0xe];
                              local_2c0[0xf] = (RTCHitN)auVar98[0xf];
                              local_2c0[0x10] = (RTCHitN)auVar98[0x10];
                              local_2c0[0x11] = (RTCHitN)auVar98[0x11];
                              local_2c0[0x12] = (RTCHitN)auVar98[0x12];
                              local_2c0[0x13] = (RTCHitN)auVar98[0x13];
                              local_2c0[0x14] = (RTCHitN)auVar98[0x14];
                              local_2c0[0x15] = (RTCHitN)auVar98[0x15];
                              local_2c0[0x16] = (RTCHitN)auVar98[0x16];
                              local_2c0[0x17] = (RTCHitN)auVar98[0x17];
                              local_2c0[0x18] = (RTCHitN)auVar98[0x18];
                              local_2c0[0x19] = (RTCHitN)auVar98[0x19];
                              local_2c0[0x1a] = (RTCHitN)auVar98[0x1a];
                              local_2c0[0x1b] = (RTCHitN)auVar98[0x1b];
                              local_2c0[0x1c] = (RTCHitN)auVar98[0x1c];
                              local_2c0[0x1d] = (RTCHitN)auVar98[0x1d];
                              local_2c0[0x1e] = (RTCHitN)auVar98[0x1e];
                              local_2c0[0x1f] = (RTCHitN)auVar98[0x1f];
                              local_2c0[0x20] = (RTCHitN)auVar98[0x20];
                              local_2c0[0x21] = (RTCHitN)auVar98[0x21];
                              local_2c0[0x22] = (RTCHitN)auVar98[0x22];
                              local_2c0[0x23] = (RTCHitN)auVar98[0x23];
                              local_2c0[0x24] = (RTCHitN)auVar98[0x24];
                              local_2c0[0x25] = (RTCHitN)auVar98[0x25];
                              local_2c0[0x26] = (RTCHitN)auVar98[0x26];
                              local_2c0[0x27] = (RTCHitN)auVar98[0x27];
                              local_2c0[0x28] = (RTCHitN)auVar98[0x28];
                              local_2c0[0x29] = (RTCHitN)auVar98[0x29];
                              local_2c0[0x2a] = (RTCHitN)auVar98[0x2a];
                              local_2c0[0x2b] = (RTCHitN)auVar98[0x2b];
                              local_2c0[0x2c] = (RTCHitN)auVar98[0x2c];
                              local_2c0[0x2d] = (RTCHitN)auVar98[0x2d];
                              local_2c0[0x2e] = (RTCHitN)auVar98[0x2e];
                              local_2c0[0x2f] = (RTCHitN)auVar98[0x2f];
                              local_2c0[0x30] = (RTCHitN)auVar98[0x30];
                              local_2c0[0x31] = (RTCHitN)auVar98[0x31];
                              local_2c0[0x32] = (RTCHitN)auVar98[0x32];
                              local_2c0[0x33] = (RTCHitN)auVar98[0x33];
                              local_2c0[0x34] = (RTCHitN)auVar98[0x34];
                              local_2c0[0x35] = (RTCHitN)auVar98[0x35];
                              local_2c0[0x36] = (RTCHitN)auVar98[0x36];
                              local_2c0[0x37] = (RTCHitN)auVar98[0x37];
                              local_2c0[0x38] = (RTCHitN)auVar98[0x38];
                              local_2c0[0x39] = (RTCHitN)auVar98[0x39];
                              local_2c0[0x3a] = (RTCHitN)auVar98[0x3a];
                              local_2c0[0x3b] = (RTCHitN)auVar98[0x3b];
                              local_2c0[0x3c] = (RTCHitN)auVar98[0x3c];
                              local_2c0[0x3d] = (RTCHitN)auVar98[0x3d];
                              local_2c0[0x3e] = (RTCHitN)auVar98[0x3e];
                              local_2c0[0x3f] = (RTCHitN)auVar98[0x3f];
                              local_180 = local_300._0_8_;
                              uStack_178 = local_300._8_8_;
                              uStack_170 = local_300._16_8_;
                              uStack_168 = local_300._24_8_;
                              uStack_160 = local_300._32_8_;
                              uStack_158 = local_300._40_8_;
                              uStack_150 = local_300._48_8_;
                              uStack_148 = local_300._56_8_;
                              auVar98 = vmovdqa64_avx512f(local_340);
                              local_140 = vmovdqa64_avx512f(auVar98);
                              vpcmpeqd_avx2(auVar98._0_32_,auVar98._0_32_);
                              local_100 = vbroadcastss_avx512f(ZEXT416(context->user->instID[0]));
                              local_c0 = vbroadcastss_avx512f(ZEXT416(context->user->instPrimID[0]))
                              ;
                              *(float *)(ray + k * 4 + 0x200) = fVar210;
                              local_440 = local_380;
                              local_5e0.valid = (int *)local_440;
                              local_5e0.geometryUserPtr = pGVar8->userPtr;
                              local_5e0.context = context->user;
                              local_5e0.ray = (RTCRayN *)ray;
                              local_5e0.hit = local_2c0;
                              local_5e0.N = 0x10;
                              if (pGVar8->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar8->occlusionFilterN)(&local_5e0);
                                auVar38 = vxorps_avx512vl(auVar97._0_16_,auVar97._0_16_);
                                auVar254 = ZEXT1664(auVar38);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar251 = ZEXT1664(auVar38);
                                auVar250 = ZEXT464(0x3f800000);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar248 = ZEXT3264(auVar69);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar249 = ZEXT1664(auVar38);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                auVar104 = ZEXT1664(auVar38);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar255 = ZEXT1664(auVar38);
                                auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
                                auVar252 = ZEXT3264(auVar69);
                              }
                              auVar38 = auVar254._0_16_;
                              auVar99 = vmovdqa64_avx512f(local_440);
                              uVar12 = vptestmd_avx512f(auVar99,auVar99);
                              if ((short)uVar12 == 0) {
                                bVar37 = false;
                              }
                              else {
                                p_Var9 = context->args->filter;
                                if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var9)(&local_5e0);
                                  auVar38 = vxorps_avx512vl(auVar38,auVar38);
                                  auVar254 = ZEXT1664(auVar38);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar251 = ZEXT1664(auVar38);
                                  auVar250 = ZEXT464(0x3f800000);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar248 = ZEXT3264(auVar69);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar249 = ZEXT1664(auVar38);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                                  auVar104 = ZEXT1664(auVar38);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar255 = ZEXT1664(auVar38);
                                  auVar69 = vbroadcastss_avx512vl(ZEXT416(2));
                                  auVar252 = ZEXT3264(auVar69);
                                }
                                auVar98 = vmovdqa64_avx512f(local_440);
                                uVar33 = vptestmd_avx512f(auVar98,auVar98);
                                auVar98 = vbroadcastss_avx512f(ZEXT416(0xff800000));
                                bVar37 = (bool)((byte)uVar33 & 1);
                                auVar99._0_4_ =
                                     (uint)bVar37 * auVar98._0_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x200);
                                bVar37 = (bool)((byte)(uVar33 >> 1) & 1);
                                auVar99._4_4_ =
                                     (uint)bVar37 * auVar98._4_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x204);
                                bVar37 = (bool)((byte)(uVar33 >> 2) & 1);
                                auVar99._8_4_ =
                                     (uint)bVar37 * auVar98._8_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x208);
                                bVar37 = (bool)((byte)(uVar33 >> 3) & 1);
                                auVar99._12_4_ =
                                     (uint)bVar37 * auVar98._12_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x20c);
                                bVar37 = (bool)((byte)(uVar33 >> 4) & 1);
                                auVar99._16_4_ =
                                     (uint)bVar37 * auVar98._16_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x210);
                                bVar37 = (bool)((byte)(uVar33 >> 5) & 1);
                                auVar99._20_4_ =
                                     (uint)bVar37 * auVar98._20_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x214);
                                bVar37 = (bool)((byte)(uVar33 >> 6) & 1);
                                auVar99._24_4_ =
                                     (uint)bVar37 * auVar98._24_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x218);
                                bVar37 = (bool)((byte)(uVar33 >> 7) & 1);
                                auVar99._28_4_ =
                                     (uint)bVar37 * auVar98._28_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x21c);
                                bVar37 = (bool)((byte)(uVar33 >> 8) & 1);
                                auVar99._32_4_ =
                                     (uint)bVar37 * auVar98._32_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x220);
                                bVar37 = (bool)((byte)(uVar33 >> 9) & 1);
                                auVar99._36_4_ =
                                     (uint)bVar37 * auVar98._36_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x224);
                                bVar37 = (bool)((byte)(uVar33 >> 10) & 1);
                                auVar99._40_4_ =
                                     (uint)bVar37 * auVar98._40_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x228);
                                bVar37 = (bool)((byte)(uVar33 >> 0xb) & 1);
                                auVar99._44_4_ =
                                     (uint)bVar37 * auVar98._44_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x22c);
                                bVar37 = (bool)((byte)(uVar33 >> 0xc) & 1);
                                auVar99._48_4_ =
                                     (uint)bVar37 * auVar98._48_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x230);
                                bVar37 = (bool)((byte)(uVar33 >> 0xd) & 1);
                                auVar99._52_4_ =
                                     (uint)bVar37 * auVar98._52_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x234);
                                bVar37 = (bool)((byte)(uVar33 >> 0xe) & 1);
                                auVar99._56_4_ =
                                     (uint)bVar37 * auVar98._56_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x238);
                                bVar37 = SUB81(uVar33 >> 0xf,0);
                                auVar99._60_4_ =
                                     (uint)bVar37 * auVar98._60_4_ |
                                     (uint)!bVar37 * *(int *)(local_5e0.ray + 0x23c);
                                *(undefined1 (*) [64])(local_5e0.ray + 0x200) = auVar99;
                                bVar37 = (short)uVar33 != 0;
                              }
                              if (!bVar37) {
                                *(float *)(ray + k * 4 + 0x200) = fVar214;
                              }
                            }
                            auVar247 = ZEXT1664(auVar51);
                            bVar36 = (bool)(bVar36 | bVar37);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar32 = lVar32 + -1;
              } while (lVar32 != 0);
            }
            goto LAB_01ddc2f3;
          }
          auVar38 = vxorps_avx512vl(ZEXT416(5),auVar55);
          auVar254 = ZEXT1664(auVar38);
        }
        auVar99._16_48_ = auVar86._16_48_;
        auVar99._0_16_ = auVar108;
      }
LAB_01ddc2f3:
      auVar98._32_32_ = auVar99._32_32_;
    } while (bVar13);
    auVar38 = vinsertps_avx512f(auVar100._0_16_,auVar41,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }